

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersector1<4>::
     occluded_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  uint uVar72;
  uint uVar73;
  ulong uVar74;
  byte bVar75;
  long lVar76;
  uint uVar77;
  ulong uVar78;
  byte unaff_R14B;
  float fVar79;
  float fVar108;
  float fVar111;
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar109;
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar99 [32];
  float fVar110;
  float fVar113;
  float fVar116;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar120;
  float fVar152;
  float fVar154;
  vint4 bi_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar156;
  undefined1 auVar125 [16];
  float fVar121;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar157;
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar134 [32];
  float fVar158;
  undefined1 auVar135 [32];
  float fVar153;
  float fVar155;
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar198;
  float fVar199;
  vint4 bi;
  undefined1 auVar184 [16];
  float fVar200;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar206;
  float fVar207;
  float fVar223;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar227;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar220 [32];
  float fVar230;
  undefined1 auVar221 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [32];
  float fVar233;
  float fVar234;
  float fVar252;
  float fVar254;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar253;
  float fVar255;
  float fVar257;
  float fVar263;
  undefined1 auVar240 [32];
  float fVar264;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar258;
  float fVar261;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar256;
  float fVar259;
  float fVar260;
  float fVar262;
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  float fVar265;
  float fVar277;
  float fVar278;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar280;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar276 [64];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  float fVar294;
  float fVar301;
  float fVar302;
  vint4 ai_1;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar307;
  float fVar312;
  float fVar313;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar310 [32];
  float fVar314;
  float fVar318;
  undefined1 auVar311 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar326 [32];
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar328 [64];
  float fVar342;
  float fVar347;
  float fVar348;
  undefined1 auVar343 [16];
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar355;
  float fVar362;
  float fVar364;
  undefined1 auVar357 [16];
  float fVar356;
  undefined1 auVar358 [16];
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar386;
  undefined1 auVar377 [28];
  float fVar376;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_ad1;
  int local_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float local_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined4 local_8d8;
  float local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  uint local_8c4;
  uint local_8c0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  undefined1 auStack_830 [16];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  Primitive *local_770;
  ulong local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  ulong local_5c0;
  undefined1 auStack_5b8 [24];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  float local_440 [4];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar327 [32];
  
  PVar7 = prim[1];
  uVar74 = (ulong)(byte)PVar7;
  auVar133 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar183 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar122._0_4_ = fVar183 * auVar133._0_4_;
  auVar122._4_4_ = fVar183 * auVar133._4_4_;
  auVar122._8_4_ = fVar183 * auVar133._8_4_;
  auVar122._12_4_ = fVar183 * auVar133._12_4_;
  auVar235._0_4_ = fVar183 * (ray->dir).field_0.m128[0];
  auVar235._4_4_ = fVar183 * (ray->dir).field_0.m128[1];
  auVar235._8_4_ = fVar183 * (ray->dir).field_0.m128[2];
  auVar235._12_4_ = fVar183 * (ray->dir).field_0.m128[3];
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar74 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar78 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar74 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar78 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar82 = vshufps_avx(auVar235,auVar235,0);
  auVar123 = vshufps_avx(auVar235,auVar235,0x55);
  auVar166 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar183 = auVar166._0_4_;
  fVar206 = auVar166._4_4_;
  fVar233 = auVar166._8_4_;
  fVar198 = auVar166._12_4_;
  fVar254 = auVar123._0_4_;
  fVar200 = auVar123._4_4_;
  fVar227 = auVar123._8_4_;
  fVar256 = auVar123._12_4_;
  fVar223 = auVar82._0_4_;
  fVar252 = auVar82._4_4_;
  fVar199 = auVar82._8_4_;
  fVar225 = auVar82._12_4_;
  auVar343._0_4_ = fVar223 * auVar133._0_4_ + fVar254 * auVar92._0_4_ + fVar183 * auVar191._0_4_;
  auVar343._4_4_ = fVar252 * auVar133._4_4_ + fVar200 * auVar92._4_4_ + fVar206 * auVar191._4_4_;
  auVar343._8_4_ = fVar199 * auVar133._8_4_ + fVar227 * auVar92._8_4_ + fVar233 * auVar191._8_4_;
  auVar343._12_4_ = fVar225 * auVar133._12_4_ + fVar256 * auVar92._12_4_ + fVar198 * auVar191._12_4_
  ;
  auVar357._0_4_ = fVar223 * auVar132._0_4_ + fVar254 * auVar10._0_4_ + auVar11._0_4_ * fVar183;
  auVar357._4_4_ = fVar252 * auVar132._4_4_ + fVar200 * auVar10._4_4_ + auVar11._4_4_ * fVar206;
  auVar357._8_4_ = fVar199 * auVar132._8_4_ + fVar227 * auVar10._8_4_ + auVar11._8_4_ * fVar233;
  auVar357._12_4_ = fVar225 * auVar132._12_4_ + fVar256 * auVar10._12_4_ + auVar11._12_4_ * fVar198;
  auVar236._0_4_ = fVar223 * auVar83._0_4_ + fVar254 * auVar84._0_4_ + auVar124._0_4_ * fVar183;
  auVar236._4_4_ = fVar252 * auVar83._4_4_ + fVar200 * auVar84._4_4_ + auVar124._4_4_ * fVar206;
  auVar236._8_4_ = fVar199 * auVar83._8_4_ + fVar227 * auVar84._8_4_ + auVar124._8_4_ * fVar233;
  auVar236._12_4_ = fVar225 * auVar83._12_4_ + fVar256 * auVar84._12_4_ + auVar124._12_4_ * fVar198;
  auVar82 = vshufps_avx(auVar122,auVar122,0);
  auVar123 = vshufps_avx(auVar122,auVar122,0x55);
  auVar166 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar183 = auVar166._0_4_;
  fVar206 = auVar166._4_4_;
  fVar233 = auVar166._8_4_;
  fVar198 = auVar166._12_4_;
  fVar254 = auVar123._0_4_;
  fVar200 = auVar123._4_4_;
  fVar227 = auVar123._8_4_;
  fVar256 = auVar123._12_4_;
  fVar223 = auVar82._0_4_;
  fVar252 = auVar82._4_4_;
  fVar199 = auVar82._8_4_;
  fVar225 = auVar82._12_4_;
  auVar266._0_4_ = fVar223 * auVar133._0_4_ + fVar254 * auVar92._0_4_ + fVar183 * auVar191._0_4_;
  auVar266._4_4_ = fVar252 * auVar133._4_4_ + fVar200 * auVar92._4_4_ + fVar206 * auVar191._4_4_;
  auVar266._8_4_ = fVar199 * auVar133._8_4_ + fVar227 * auVar92._8_4_ + fVar233 * auVar191._8_4_;
  auVar266._12_4_ = fVar225 * auVar133._12_4_ + fVar256 * auVar92._12_4_ + fVar198 * auVar191._12_4_
  ;
  auVar82._0_4_ = fVar223 * auVar132._0_4_ + auVar11._0_4_ * fVar183 + fVar254 * auVar10._0_4_;
  auVar82._4_4_ = fVar252 * auVar132._4_4_ + auVar11._4_4_ * fVar206 + fVar200 * auVar10._4_4_;
  auVar82._8_4_ = fVar199 * auVar132._8_4_ + auVar11._8_4_ * fVar233 + fVar227 * auVar10._8_4_;
  auVar82._12_4_ = fVar225 * auVar132._12_4_ + auVar11._12_4_ * fVar198 + fVar256 * auVar10._12_4_;
  auVar295._8_4_ = 0x7fffffff;
  auVar295._0_8_ = 0x7fffffff7fffffff;
  auVar295._12_4_ = 0x7fffffff;
  auVar133 = vandps_avx(auVar343,auVar295);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar133 = vcmpps_avx(auVar133,auVar208,1);
  auVar92 = vblendvps_avx(auVar343,auVar208,auVar133);
  auVar133 = vandps_avx(auVar357,auVar295);
  auVar133 = vcmpps_avx(auVar133,auVar208,1);
  auVar191 = vblendvps_avx(auVar357,auVar208,auVar133);
  auVar133 = vandps_avx(auVar295,auVar236);
  auVar133 = vcmpps_avx(auVar133,auVar208,1);
  auVar133 = vblendvps_avx(auVar236,auVar208,auVar133);
  auVar123._0_4_ = fVar223 * auVar83._0_4_ + fVar254 * auVar84._0_4_ + auVar124._0_4_ * fVar183;
  auVar123._4_4_ = fVar252 * auVar83._4_4_ + fVar200 * auVar84._4_4_ + auVar124._4_4_ * fVar206;
  auVar123._8_4_ = fVar199 * auVar83._8_4_ + fVar227 * auVar84._8_4_ + auVar124._8_4_ * fVar233;
  auVar123._12_4_ = fVar225 * auVar83._12_4_ + fVar256 * auVar84._12_4_ + auVar124._12_4_ * fVar198;
  auVar132 = vrcpps_avx(auVar92);
  fVar183 = auVar132._0_4_;
  auVar184._0_4_ = fVar183 * auVar92._0_4_;
  fVar198 = auVar132._4_4_;
  auVar184._4_4_ = fVar198 * auVar92._4_4_;
  fVar199 = auVar132._8_4_;
  auVar184._8_4_ = fVar199 * auVar92._8_4_;
  fVar200 = auVar132._12_4_;
  auVar184._12_4_ = fVar200 * auVar92._12_4_;
  auVar296._8_4_ = 0x3f800000;
  auVar296._0_8_ = &DAT_3f8000003f800000;
  auVar296._12_4_ = 0x3f800000;
  auVar92 = vsubps_avx(auVar296,auVar184);
  fVar183 = fVar183 + fVar183 * auVar92._0_4_;
  fVar198 = fVar198 + fVar198 * auVar92._4_4_;
  fVar199 = fVar199 + fVar199 * auVar92._8_4_;
  fVar200 = fVar200 + fVar200 * auVar92._12_4_;
  auVar92 = vrcpps_avx(auVar191);
  fVar206 = auVar92._0_4_;
  auVar209._0_4_ = fVar206 * auVar191._0_4_;
  fVar223 = auVar92._4_4_;
  auVar209._4_4_ = fVar223 * auVar191._4_4_;
  fVar225 = auVar92._8_4_;
  auVar209._8_4_ = fVar225 * auVar191._8_4_;
  fVar227 = auVar92._12_4_;
  auVar209._12_4_ = fVar227 * auVar191._12_4_;
  auVar92 = vsubps_avx(auVar296,auVar209);
  fVar206 = fVar206 + fVar206 * auVar92._0_4_;
  fVar223 = fVar223 + fVar223 * auVar92._4_4_;
  fVar225 = fVar225 + fVar225 * auVar92._8_4_;
  fVar227 = fVar227 + fVar227 * auVar92._12_4_;
  auVar92 = vrcpps_avx(auVar133);
  fVar233 = auVar92._0_4_;
  auVar237._0_4_ = fVar233 * auVar133._0_4_;
  fVar252 = auVar92._4_4_;
  auVar237._4_4_ = fVar252 * auVar133._4_4_;
  fVar254 = auVar92._8_4_;
  auVar237._8_4_ = fVar254 * auVar133._8_4_;
  fVar256 = auVar92._12_4_;
  auVar237._12_4_ = fVar256 * auVar133._12_4_;
  auVar92 = vsubps_avx(auVar296,auVar237);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar133 = vpmovsxwd_avx(auVar133);
  fVar233 = fVar233 + fVar233 * auVar92._0_4_;
  fVar252 = fVar252 + fVar252 * auVar92._4_4_;
  fVar254 = fVar254 + fVar254 * auVar92._8_4_;
  fVar256 = fVar256 + fVar256 * auVar92._12_4_;
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar266);
  auVar166._0_4_ = fVar183 * auVar133._0_4_;
  auVar166._4_4_ = fVar198 * auVar133._4_4_;
  auVar166._8_4_ = fVar199 * auVar133._8_4_;
  auVar166._12_4_ = fVar200 * auVar133._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar133 = vpmovsxwd_avx(auVar92);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar266);
  auVar185._0_4_ = fVar183 * auVar133._0_4_;
  auVar185._4_4_ = fVar198 * auVar133._4_4_;
  auVar185._8_4_ = fVar199 * auVar133._8_4_;
  auVar185._12_4_ = fVar200 * auVar133._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar92 = vpmovsxwd_avx(auVar191);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar74 * -2 + 6);
  auVar133 = vpmovsxwd_avx(auVar132);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar82);
  auVar297._0_4_ = auVar133._0_4_ * fVar206;
  auVar297._4_4_ = auVar133._4_4_ * fVar223;
  auVar297._8_4_ = auVar133._8_4_ * fVar225;
  auVar297._12_4_ = auVar133._12_4_ * fVar227;
  auVar133 = vcvtdq2ps_avx(auVar92);
  auVar133 = vsubps_avx(auVar133,auVar82);
  auVar83._0_4_ = fVar206 * auVar133._0_4_;
  auVar83._4_4_ = fVar223 * auVar133._4_4_;
  auVar83._8_4_ = fVar225 * auVar133._8_4_;
  auVar83._12_4_ = fVar227 * auVar133._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 + uVar74 + 6);
  auVar133 = vpmovsxwd_avx(auVar10);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar123);
  auVar210._0_4_ = auVar133._0_4_ * fVar233;
  auVar210._4_4_ = auVar133._4_4_ * fVar252;
  auVar210._8_4_ = auVar133._8_4_ * fVar254;
  auVar210._12_4_ = auVar133._12_4_ * fVar256;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 6);
  auVar133 = vpmovsxwd_avx(auVar11);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar123);
  auVar124._0_4_ = auVar133._0_4_ * fVar233;
  auVar124._4_4_ = auVar133._4_4_ * fVar252;
  auVar124._8_4_ = auVar133._8_4_ * fVar254;
  auVar124._12_4_ = auVar133._12_4_ * fVar256;
  auVar133 = vpminsd_avx(auVar166,auVar185);
  auVar92 = vpminsd_avx(auVar297,auVar83);
  auVar133 = vmaxps_avx(auVar133,auVar92);
  auVar92 = vpminsd_avx(auVar210,auVar124);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar308._4_4_ = uVar2;
  auVar308._0_4_ = uVar2;
  auVar308._8_4_ = uVar2;
  auVar308._12_4_ = uVar2;
  auVar92 = vmaxps_avx(auVar92,auVar308);
  auVar133 = vmaxps_avx(auVar133,auVar92);
  local_3f0._0_4_ = auVar133._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar133._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar133._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar133._12_4_ * 0.99999964;
  auVar133 = vpmaxsd_avx(auVar166,auVar185);
  auVar92 = vpmaxsd_avx(auVar297,auVar83);
  auVar133 = vminps_avx(auVar133,auVar92);
  auVar92 = vpmaxsd_avx(auVar210,auVar124);
  fVar183 = ray->tfar;
  auVar167._4_4_ = fVar183;
  auVar167._0_4_ = fVar183;
  auVar167._8_4_ = fVar183;
  auVar167._12_4_ = fVar183;
  auVar92 = vminps_avx(auVar92,auVar167);
  auVar133 = vminps_avx(auVar133,auVar92);
  auVar84._0_4_ = auVar133._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar133._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar133._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar133._12_4_ * 1.0000004;
  auVar133 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar92 = vpcmpgtd_avx(auVar133,_DAT_01ff0cf0);
  auVar133 = vcmpps_avx(local_3f0,auVar84,2);
  auVar133 = vandps_avx(auVar133,auVar92);
  uVar72 = vmovmskps_avx(auVar133);
  local_ad1 = uVar72 != 0;
  if (uVar72 == 0) {
    return local_ad1;
  }
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  uVar72 = uVar72 & 0xff;
  local_340 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_770 = prim;
LAB_00f1a358:
  local_768 = (ulong)uVar72;
  lVar76 = 0;
  if (local_768 != 0) {
    for (; (uVar72 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  local_a48 = (ulong)*(uint *)(local_770 + 2);
  local_8a8 = (ulong)*(uint *)(local_770 + lVar76 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_a48].ptr;
  lVar76 = *(long *)&pGVar8[1].time_range.upper;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_8a8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar133 = *(undefined1 (*) [16])(lVar76 + (long)pGVar8[1].intersectionFilterN * uVar78);
  auVar92 = *(undefined1 (*) [16])(lVar76 + (long)pGVar8[1].intersectionFilterN * (uVar78 + 1));
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + uVar78 * (long)pGVar8[2].pointQueryFunc);
  auVar211._0_4_ = auVar133._0_4_ + *pfVar1 * 0.33333334;
  auVar211._4_4_ = auVar133._4_4_ + pfVar1[1] * 0.33333334;
  auVar211._8_4_ = auVar133._8_4_ + pfVar1[2] * 0.33333334;
  auVar211._12_4_ = auVar133._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * (uVar78 + 1));
  auVar85._0_4_ = *pfVar1 * 0.33333334;
  auVar85._4_4_ = pfVar1[1] * 0.33333334;
  auVar85._8_4_ = pfVar1[2] * 0.33333334;
  auVar85._12_4_ = pfVar1[3] * 0.33333334;
  auVar11 = vsubps_avx(auVar92,auVar85);
  auVar86._0_4_ = (auVar92._0_4_ + auVar133._0_4_ + auVar211._0_4_ + auVar11._0_4_) * 0.25;
  auVar86._4_4_ = (auVar92._4_4_ + auVar133._4_4_ + auVar211._4_4_ + auVar11._4_4_) * 0.25;
  auVar86._8_4_ = (auVar92._8_4_ + auVar133._8_4_ + auVar211._8_4_ + auVar11._8_4_) * 0.25;
  auVar86._12_4_ = (auVar92._12_4_ + auVar133._12_4_ + auVar211._12_4_ + auVar11._12_4_) * 0.25;
  aVar4 = (ray->org).field_0.field_1;
  aVar5 = (ray->dir).field_0.field_1;
  auVar191 = vsubps_avx(auVar86,(undefined1  [16])aVar4);
  auVar191 = vdpps_avx(auVar191,(undefined1  [16])aVar5,0x7f);
  auVar132 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar10 = vrcpss_avx(auVar132,auVar132);
  fVar183 = auVar191._0_4_ * auVar10._0_4_ * (2.0 - auVar10._0_4_ * auVar132._0_4_);
  local_790 = ZEXT416((uint)fVar183);
  auVar132 = vshufps_avx(local_790,ZEXT416((uint)fVar183),0);
  fVar183 = aVar5.x;
  fVar206 = aVar5.y;
  fVar233 = aVar5.z;
  aVar156 = aVar5.field_3;
  auVar267._0_4_ = aVar4.x + fVar183 * auVar132._0_4_;
  auVar267._4_4_ = aVar4.y + fVar206 * auVar132._4_4_;
  auVar267._8_4_ = aVar4.z + fVar233 * auVar132._8_4_;
  auVar267._12_4_ = aVar4.field_3.w + aVar156.w * auVar132._12_4_;
  auVar191 = vblendps_avx(auVar267,_DAT_01feba10,8);
  _local_9c0 = vsubps_avx(auVar133,auVar191);
  _local_9d0 = vsubps_avx(auVar11,auVar191);
  auVar250 = ZEXT1664(_local_9d0);
  _local_9e0 = vsubps_avx(auVar211,auVar191);
  _local_9f0 = vsubps_avx(auVar92,auVar191);
  auVar276 = ZEXT1664(_local_9f0);
  auVar133 = vshufps_avx(_local_9c0,_local_9c0,0);
  local_800._16_16_ = auVar133;
  local_800._0_16_ = auVar133;
  auVar293 = ZEXT3264(local_800);
  auVar133 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001290 = auVar133;
  _local_1c0 = auVar133;
  auVar133 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001290 = auVar133;
  _local_1e0 = auVar133;
  auVar133 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  local_900._16_16_ = auVar133;
  local_900._0_16_ = auVar133;
  auVar328 = ZEXT3264(local_900);
  auVar133 = vshufps_avx(_local_9e0,_local_9e0,0);
  local_1a0._16_16_ = auVar133;
  local_1a0._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  local_460._16_16_ = auVar133;
  local_460._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001290 = auVar133;
  _local_200 = auVar133;
  auVar125._0_4_ = fVar183 * fVar183;
  auVar125._4_4_ = fVar206 * fVar206;
  auVar125._8_4_ = fVar233 * fVar233;
  auVar125._12_4_ = aVar156.w * aVar156.w;
  auVar133 = vshufps_avx(auVar125,auVar125,0xaa);
  auVar92 = vshufps_avx(auVar125,auVar125,0x55);
  auVar191 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  local_a20._16_16_ = auVar191;
  local_a20._0_16_ = auVar191;
  auVar322 = ZEXT3264(local_a20);
  auVar191 = vshufps_avx(auVar125,auVar125,0);
  local_220._0_4_ = auVar191._0_4_ + auVar92._0_4_ + auVar133._0_4_;
  local_220._4_4_ = auVar191._4_4_ + auVar92._4_4_ + auVar133._4_4_;
  local_220._8_4_ = auVar191._8_4_ + auVar92._8_4_ + auVar133._8_4_;
  local_220._12_4_ = auVar191._12_4_ + auVar92._12_4_ + auVar133._12_4_;
  local_220._16_4_ = auVar191._0_4_ + auVar92._0_4_ + auVar133._0_4_;
  local_220._20_4_ = auVar191._4_4_ + auVar92._4_4_ + auVar133._4_4_;
  local_220._24_4_ = auVar191._8_4_ + auVar92._8_4_ + auVar133._8_4_;
  local_220._28_4_ = auVar191._12_4_ + auVar92._12_4_ + auVar133._12_4_;
  auVar133 = vshufps_avx(_local_9d0,_local_9d0,0);
  local_2c0._16_16_ = auVar133;
  local_2c0._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  local_2e0._16_16_ = auVar133;
  local_2e0._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  local_300._16_16_ = auVar133;
  local_300._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  register0x00001250 = auVar133;
  _local_240 = auVar133;
  auVar133 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001250 = auVar133;
  _local_260 = auVar133;
  auVar133 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  local_320._16_16_ = auVar133;
  local_320._0_16_ = auVar133;
  auVar133 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001250 = auVar133;
  _local_280 = auVar133;
  auVar133 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001250 = auVar133;
  _local_2a0 = auVar133;
  register0x00001210 = auVar132;
  _local_7c0 = auVar132;
  uVar78 = 1;
  uVar74 = 0;
  bVar75 = 0;
  local_5a0 = (ray->dir).field_0.m128[0];
  local_4a0 = (ray->dir).field_0.m128[1];
  local_480 = (ray->dir).field_0.m128[2];
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  local_360 = vandps_avx(local_220,auVar98);
  local_780 = ZEXT816(0x3f80000000000000);
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  fStack_49c = local_4a0;
  fStack_498 = local_4a0;
  fStack_494 = local_4a0;
  fStack_490 = local_4a0;
  fStack_48c = local_4a0;
  fStack_488 = local_4a0;
  fStack_484 = local_4a0;
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  do {
    auVar133 = vmovshdup_avx(local_780);
    fVar225 = auVar133._0_4_ - local_780._0_4_;
    auVar133 = vshufps_avx(local_780,local_780,0);
    local_6a0._16_16_ = auVar133;
    local_6a0._0_16_ = auVar133;
    auVar92 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
    _fStack_930 = auVar92;
    _local_940 = auVar92;
    fVar120 = auVar92._0_4_;
    fVar152 = auVar92._4_4_;
    fVar154 = auVar92._8_4_;
    fVar157 = auVar92._12_4_;
    fVar79 = auVar133._0_4_;
    auVar134._0_4_ = fVar79 + fVar120 * 0.0;
    fVar108 = auVar133._4_4_;
    auVar134._4_4_ = fVar108 + fVar152 * 0.14285715;
    fVar111 = auVar133._8_4_;
    auVar134._8_4_ = fVar111 + fVar154 * 0.2857143;
    fVar114 = auVar133._12_4_;
    auVar134._12_4_ = fVar114 + fVar157 * 0.42857146;
    auVar134._16_4_ = fVar79 + fVar120 * 0.5714286;
    auVar134._20_4_ = fVar108 + fVar152 * 0.71428573;
    auVar134._24_4_ = fVar111 + fVar154 * 0.8571429;
    auVar134._28_4_ = fVar114 + fVar157;
    auVar176._8_4_ = 0x3f800000;
    auVar176._0_8_ = &DAT_3f8000003f800000;
    auVar176._12_4_ = 0x3f800000;
    auVar176._16_4_ = 0x3f800000;
    auVar176._20_4_ = 0x3f800000;
    auVar176._24_4_ = 0x3f800000;
    auVar176._28_4_ = 0x3f800000;
    auVar97 = vsubps_avx(auVar176,auVar134);
    fVar183 = auVar97._0_4_;
    fVar206 = auVar97._4_4_;
    fVar233 = auVar97._8_4_;
    fVar198 = auVar97._12_4_;
    fVar223 = auVar97._16_4_;
    fVar252 = auVar97._20_4_;
    fVar199 = auVar97._24_4_;
    fVar230 = local_460._28_4_;
    fVar263 = auVar250._28_4_;
    fVar205 = auVar276._28_4_ + fVar263 + fVar230 + local_1a0._28_4_ + auVar293._28_4_;
    fVar265 = local_2c0._0_4_ * auVar134._0_4_ + local_1a0._0_4_ * fVar183;
    fVar277 = local_2c0._4_4_ * auVar134._4_4_ + local_1a0._4_4_ * fVar206;
    fVar278 = local_2c0._8_4_ * auVar134._8_4_ + local_1a0._8_4_ * fVar233;
    fVar280 = local_2c0._12_4_ * auVar134._12_4_ + local_1a0._12_4_ * fVar198;
    fVar282 = local_2c0._16_4_ * auVar134._16_4_ + local_1a0._16_4_ * fVar223;
    fVar284 = local_2c0._20_4_ * auVar134._20_4_ + local_1a0._20_4_ * fVar252;
    fVar286 = local_2c0._24_4_ * auVar134._24_4_ + local_1a0._24_4_ * fVar199;
    fVar200 = local_2e0._0_4_ * auVar134._0_4_ + local_460._0_4_ * fVar183;
    fVar227 = local_2e0._4_4_ * auVar134._4_4_ + local_460._4_4_ * fVar206;
    fVar256 = local_2e0._8_4_ * auVar134._8_4_ + local_460._8_4_ * fVar233;
    fVar201 = local_2e0._12_4_ * auVar134._12_4_ + local_460._12_4_ * fVar198;
    fVar202 = local_2e0._16_4_ * auVar134._16_4_ + local_460._16_4_ * fVar223;
    fVar203 = local_2e0._20_4_ * auVar134._20_4_ + local_460._20_4_ * fVar252;
    fVar204 = local_2e0._24_4_ * auVar134._24_4_ + local_460._24_4_ * fVar199;
    fVar207 = local_300._0_4_ * auVar134._0_4_ + (float)local_200._0_4_ * fVar183;
    fVar224 = local_300._4_4_ * auVar134._4_4_ + (float)local_200._4_4_ * fVar206;
    fVar226 = local_300._8_4_ * auVar134._8_4_ + fStack_1f8 * fVar233;
    fVar228 = local_300._12_4_ * auVar134._12_4_ + fStack_1f4 * fVar198;
    fVar229 = local_300._16_4_ * auVar134._16_4_ + fStack_1f0 * fVar223;
    fVar231 = local_300._20_4_ * auVar134._20_4_ + fStack_1ec * fVar252;
    fVar232 = local_300._24_4_ * auVar134._24_4_ + fStack_1e8 * fVar199;
    fVar234 = (float)local_240._0_4_ * auVar134._0_4_ + auVar322._0_4_ * fVar183;
    fVar253 = (float)local_240._4_4_ * auVar134._4_4_ + auVar322._4_4_ * fVar206;
    fVar255 = fStack_238 * auVar134._8_4_ + auVar322._8_4_ * fVar233;
    fVar257 = fStack_234 * auVar134._12_4_ + auVar322._12_4_ * fVar198;
    fVar259 = fStack_230 * auVar134._16_4_ + auVar322._16_4_ * fVar223;
    fVar260 = fStack_22c * auVar134._20_4_ + auVar322._20_4_ * fVar252;
    fVar262 = fStack_228 * auVar134._24_4_ + auVar322._24_4_ * fVar199;
    fVar258 = auVar328._28_4_;
    fVar374 = fVar258 + local_1a0._28_4_;
    fVar353 = local_320._28_4_ + fVar258;
    auVar378._0_4_ =
         fVar183 * (local_1a0._0_4_ * auVar134._0_4_ + auVar293._0_4_ * fVar183) +
         auVar134._0_4_ * fVar265;
    auVar378._4_4_ =
         fVar206 * (local_1a0._4_4_ * auVar134._4_4_ + auVar293._4_4_ * fVar206) +
         auVar134._4_4_ * fVar277;
    auVar378._8_4_ =
         fVar233 * (local_1a0._8_4_ * auVar134._8_4_ + auVar293._8_4_ * fVar233) +
         auVar134._8_4_ * fVar278;
    auVar378._12_4_ =
         fVar198 * (local_1a0._12_4_ * auVar134._12_4_ + auVar293._12_4_ * fVar198) +
         auVar134._12_4_ * fVar280;
    auVar378._16_4_ =
         fVar223 * (local_1a0._16_4_ * auVar134._16_4_ + auVar293._16_4_ * fVar223) +
         auVar134._16_4_ * fVar282;
    auVar378._20_4_ =
         fVar252 * (local_1a0._20_4_ * auVar134._20_4_ + auVar293._20_4_ * fVar252) +
         auVar134._20_4_ * fVar284;
    auVar378._24_4_ =
         fVar199 * (local_1a0._24_4_ * auVar134._24_4_ + auVar293._24_4_ * fVar199) +
         auVar134._24_4_ * fVar286;
    auVar378._28_4_ = local_300._28_4_ + fVar258;
    auVar319._0_4_ =
         fVar183 * (local_460._0_4_ * auVar134._0_4_ + fVar183 * (float)local_1c0._0_4_) +
         auVar134._0_4_ * fVar200;
    auVar319._4_4_ =
         fVar206 * (local_460._4_4_ * auVar134._4_4_ + fVar206 * (float)local_1c0._4_4_) +
         auVar134._4_4_ * fVar227;
    auVar319._8_4_ =
         fVar233 * (local_460._8_4_ * auVar134._8_4_ + fVar233 * fStack_1b8) +
         auVar134._8_4_ * fVar256;
    auVar319._12_4_ =
         fVar198 * (local_460._12_4_ * auVar134._12_4_ + fVar198 * fStack_1b4) +
         auVar134._12_4_ * fVar201;
    auVar319._16_4_ =
         fVar223 * (local_460._16_4_ * auVar134._16_4_ + fVar223 * fStack_1b0) +
         auVar134._16_4_ * fVar202;
    auVar319._20_4_ =
         fVar252 * (local_460._20_4_ * auVar134._20_4_ + fVar252 * fStack_1ac) +
         auVar134._20_4_ * fVar203;
    auVar319._24_4_ =
         fVar199 * (local_460._24_4_ * auVar134._24_4_ + fVar199 * fStack_1a8) +
         auVar134._24_4_ * fVar204;
    auVar319._28_4_ = auVar322._28_4_ + fVar258;
    fVar254 = local_2e0._28_4_;
    auVar326._0_4_ =
         fVar183 * ((float)local_200._0_4_ * auVar134._0_4_ + fVar183 * (float)local_1e0._0_4_) +
         auVar134._0_4_ * fVar207;
    auVar326._4_4_ =
         fVar206 * ((float)local_200._4_4_ * auVar134._4_4_ + fVar206 * (float)local_1e0._4_4_) +
         auVar134._4_4_ * fVar224;
    auVar326._8_4_ =
         fVar233 * (fStack_1f8 * auVar134._8_4_ + fVar233 * fStack_1d8) + auVar134._8_4_ * fVar226;
    auVar326._12_4_ =
         fVar198 * (fStack_1f4 * auVar134._12_4_ + fVar198 * fStack_1d4) + auVar134._12_4_ * fVar228
    ;
    auVar326._16_4_ =
         fVar223 * (fStack_1f0 * auVar134._16_4_ + fVar223 * fStack_1d0) + auVar134._16_4_ * fVar229
    ;
    auVar326._20_4_ =
         fVar252 * (fStack_1ec * auVar134._20_4_ + fVar252 * fStack_1cc) + auVar134._20_4_ * fVar231
    ;
    auVar326._24_4_ =
         fVar199 * (fStack_1e8 * auVar134._24_4_ + fVar199 * fStack_1c8) + auVar134._24_4_ * fVar232
    ;
    auVar326._28_4_ = fVar254 + fVar258;
    auVar288._0_4_ =
         auVar134._0_4_ * fVar234 +
         fVar183 * (auVar322._0_4_ * auVar134._0_4_ + auVar328._0_4_ * fVar183);
    auVar288._4_4_ =
         auVar134._4_4_ * fVar253 +
         fVar206 * (auVar322._4_4_ * auVar134._4_4_ + auVar328._4_4_ * fVar206);
    auVar288._8_4_ =
         auVar134._8_4_ * fVar255 +
         fVar233 * (auVar322._8_4_ * auVar134._8_4_ + auVar328._8_4_ * fVar233);
    auVar288._12_4_ =
         auVar134._12_4_ * fVar257 +
         fVar198 * (auVar322._12_4_ * auVar134._12_4_ + auVar328._12_4_ * fVar198);
    auVar288._16_4_ =
         auVar134._16_4_ * fVar259 +
         fVar223 * (auVar322._16_4_ * auVar134._16_4_ + auVar328._16_4_ * fVar223);
    auVar288._20_4_ =
         auVar134._20_4_ * fVar260 +
         fVar252 * (auVar322._20_4_ * auVar134._20_4_ + auVar328._20_4_ * fVar252);
    auVar288._24_4_ =
         auVar134._24_4_ * fVar262 +
         fVar199 * (auVar322._24_4_ * auVar134._24_4_ + auVar328._24_4_ * fVar199);
    auVar288._28_4_ = fVar254 + fStack_224;
    auVar269._0_4_ =
         (auVar134._0_4_ * (float)local_260._0_4_ + local_2c0._0_4_ * fVar183) * auVar134._0_4_ +
         fVar183 * fVar265;
    auVar269._4_4_ =
         (auVar134._4_4_ * (float)local_260._4_4_ + local_2c0._4_4_ * fVar206) * auVar134._4_4_ +
         fVar206 * fVar277;
    auVar269._8_4_ =
         (auVar134._8_4_ * fStack_258 + local_2c0._8_4_ * fVar233) * auVar134._8_4_ +
         fVar233 * fVar278;
    auVar269._12_4_ =
         (auVar134._12_4_ * fStack_254 + local_2c0._12_4_ * fVar198) * auVar134._12_4_ +
         fVar198 * fVar280;
    auVar269._16_4_ =
         (auVar134._16_4_ * fStack_250 + local_2c0._16_4_ * fVar223) * auVar134._16_4_ +
         fVar223 * fVar282;
    auVar269._20_4_ =
         (auVar134._20_4_ * fStack_24c + local_2c0._20_4_ * fVar252) * auVar134._20_4_ +
         fVar252 * fVar284;
    auVar269._24_4_ =
         (auVar134._24_4_ * fStack_248 + local_2c0._24_4_ * fVar199) * auVar134._24_4_ +
         fVar199 * fVar286;
    auVar269._28_4_ = fVar254 + fVar205 + auVar276._28_4_;
    auVar195._0_4_ =
         (local_320._0_4_ * auVar134._0_4_ + local_2e0._0_4_ * fVar183) * auVar134._0_4_ +
         fVar183 * fVar200;
    auVar195._4_4_ =
         (local_320._4_4_ * auVar134._4_4_ + local_2e0._4_4_ * fVar206) * auVar134._4_4_ +
         fVar206 * fVar227;
    auVar195._8_4_ =
         (local_320._8_4_ * auVar134._8_4_ + local_2e0._8_4_ * fVar233) * auVar134._8_4_ +
         fVar233 * fVar256;
    auVar195._12_4_ =
         (local_320._12_4_ * auVar134._12_4_ + local_2e0._12_4_ * fVar198) * auVar134._12_4_ +
         fVar198 * fVar201;
    auVar195._16_4_ =
         (local_320._16_4_ * auVar134._16_4_ + local_2e0._16_4_ * fVar223) * auVar134._16_4_ +
         fVar223 * fVar202;
    auVar195._20_4_ =
         (local_320._20_4_ * auVar134._20_4_ + local_2e0._20_4_ * fVar252) * auVar134._20_4_ +
         fVar252 * fVar203;
    auVar195._24_4_ =
         (local_320._24_4_ * auVar134._24_4_ + local_2e0._24_4_ * fVar199) * auVar134._24_4_ +
         fVar199 * fVar204;
    auVar195._28_4_ = fVar254 + fVar230 + fVar205;
    auVar220._0_4_ =
         auVar134._0_4_ * (auVar134._0_4_ * (float)local_280._0_4_ + local_300._0_4_ * fVar183) +
         fVar183 * fVar207;
    auVar220._4_4_ =
         auVar134._4_4_ * (auVar134._4_4_ * (float)local_280._4_4_ + local_300._4_4_ * fVar206) +
         fVar206 * fVar224;
    auVar220._8_4_ =
         auVar134._8_4_ * (auVar134._8_4_ * fStack_278 + local_300._8_4_ * fVar233) +
         fVar233 * fVar226;
    auVar220._12_4_ =
         auVar134._12_4_ * (auVar134._12_4_ * fStack_274 + local_300._12_4_ * fVar198) +
         fVar198 * fVar228;
    auVar220._16_4_ =
         auVar134._16_4_ * (auVar134._16_4_ * fStack_270 + local_300._16_4_ * fVar223) +
         fVar223 * fVar229;
    auVar220._20_4_ =
         auVar134._20_4_ * (auVar134._20_4_ * fStack_26c + local_300._20_4_ * fVar252) +
         fVar252 * fVar231;
    auVar220._24_4_ =
         auVar134._24_4_ * (auVar134._24_4_ * fStack_268 + local_300._24_4_ * fVar199) +
         fVar199 * fVar232;
    auVar220._28_4_ = fVar353 + fVar263 + fVar230;
    auVar240._0_4_ =
         (auVar134._0_4_ * (float)local_2a0._0_4_ + (float)local_240._0_4_ * fVar183) *
         auVar134._0_4_ + fVar183 * fVar234;
    auVar240._4_4_ =
         (auVar134._4_4_ * (float)local_2a0._4_4_ + (float)local_240._4_4_ * fVar206) *
         auVar134._4_4_ + fVar206 * fVar253;
    auVar240._8_4_ =
         (auVar134._8_4_ * fStack_298 + fStack_238 * fVar233) * auVar134._8_4_ + fVar233 * fVar255;
    auVar240._12_4_ =
         (auVar134._12_4_ * fStack_294 + fStack_234 * fVar198) * auVar134._12_4_ + fVar198 * fVar257
    ;
    auVar240._16_4_ =
         (auVar134._16_4_ * fStack_290 + fStack_230 * fVar223) * auVar134._16_4_ + fVar223 * fVar259
    ;
    auVar240._20_4_ =
         (auVar134._20_4_ * fStack_28c + fStack_22c * fVar252) * auVar134._20_4_ + fVar252 * fVar260
    ;
    auVar240._24_4_ =
         (auVar134._24_4_ * fStack_288 + fStack_228 * fVar199) * auVar134._24_4_ + fVar199 * fVar262
    ;
    auVar240._28_4_ = fVar374 + fVar258 + fVar263;
    fVar80 = auVar378._0_4_ * fVar183 + auVar134._0_4_ * auVar269._0_4_;
    fVar109 = auVar378._4_4_ * fVar206 + auVar134._4_4_ * auVar269._4_4_;
    fVar112 = auVar378._8_4_ * fVar233 + auVar134._8_4_ * auVar269._8_4_;
    fVar115 = auVar378._12_4_ * fVar198 + auVar134._12_4_ * auVar269._12_4_;
    fStack_a90 = auVar378._16_4_ * fVar223 + auVar134._16_4_ * auVar269._16_4_;
    fStack_a8c = auVar378._20_4_ * fVar252 + auVar134._20_4_ * auVar269._20_4_;
    fStack_a88 = auVar378._24_4_ * fVar199 + auVar134._24_4_ * auVar269._24_4_;
    fStack_a84 = fVar374 + fVar254;
    auVar387._0_4_ = auVar319._0_4_ * fVar183 + auVar134._0_4_ * auVar195._0_4_;
    auVar387._4_4_ = auVar319._4_4_ * fVar206 + auVar134._4_4_ * auVar195._4_4_;
    auVar387._8_4_ = auVar319._8_4_ * fVar233 + auVar134._8_4_ * auVar195._8_4_;
    auVar387._12_4_ = auVar319._12_4_ * fVar198 + auVar134._12_4_ * auVar195._12_4_;
    auVar387._16_4_ = auVar319._16_4_ * fVar223 + auVar134._16_4_ * auVar195._16_4_;
    auVar387._20_4_ = auVar319._20_4_ * fVar252 + auVar134._20_4_ * auVar195._20_4_;
    auVar387._24_4_ = auVar319._24_4_ * fVar199 + auVar134._24_4_ * auVar195._24_4_;
    auVar387._28_4_ = fVar254 + fVar353;
    auVar310._0_4_ = auVar326._0_4_ * fVar183 + auVar134._0_4_ * auVar220._0_4_;
    auVar310._4_4_ = auVar326._4_4_ * fVar206 + auVar134._4_4_ * auVar220._4_4_;
    auVar310._8_4_ = auVar326._8_4_ * fVar233 + auVar134._8_4_ * auVar220._8_4_;
    auVar310._12_4_ = auVar326._12_4_ * fVar198 + auVar134._12_4_ * auVar220._12_4_;
    auVar310._16_4_ = auVar326._16_4_ * fVar223 + auVar134._16_4_ * auVar220._16_4_;
    auVar310._20_4_ = auVar326._20_4_ * fVar252 + auVar134._20_4_ * auVar220._20_4_;
    auVar310._24_4_ = auVar326._24_4_ * fVar199 + auVar134._24_4_ * auVar220._24_4_;
    auVar310._28_4_ = fVar353 + fVar254;
    local_8a0._0_4_ = fVar183 * auVar288._0_4_ + auVar134._0_4_ * auVar240._0_4_;
    local_8a0._4_4_ = fVar206 * auVar288._4_4_ + auVar134._4_4_ * auVar240._4_4_;
    fStack_898 = fVar233 * auVar288._8_4_ + auVar134._8_4_ * auVar240._8_4_;
    fStack_894 = fVar198 * auVar288._12_4_ + auVar134._12_4_ * auVar240._12_4_;
    fStack_890 = fVar223 * auVar288._16_4_ + auVar134._16_4_ * auVar240._16_4_;
    fStack_88c = fVar252 * auVar288._20_4_ + auVar134._20_4_ * auVar240._20_4_;
    fStack_888 = fVar199 * auVar288._24_4_ + auVar134._24_4_ * auVar240._24_4_;
    fStack_884 = auVar97._28_4_ + auVar134._28_4_;
    auVar13 = vsubps_avx(auVar269,auVar378);
    auVar97 = vsubps_avx(auVar195,auVar319);
    auVar98 = vsubps_avx(auVar220,auVar326);
    auVar134 = vsubps_avx(auVar240,auVar288);
    auVar133 = vshufps_avx(ZEXT416((uint)(fVar225 * 0.04761905)),
                           ZEXT416((uint)(fVar225 * 0.04761905)),0);
    fVar256 = auVar133._0_4_;
    fVar355 = fVar256 * auVar13._0_4_ * 3.0;
    fVar201 = auVar133._4_4_;
    fVar362 = fVar201 * auVar13._4_4_ * 3.0;
    auVar19._4_4_ = fVar362;
    auVar19._0_4_ = fVar355;
    fVar205 = auVar133._8_4_;
    fVar364 = fVar205 * auVar13._8_4_ * 3.0;
    auVar19._8_4_ = fVar364;
    fVar227 = auVar133._12_4_;
    fVar366 = fVar227 * auVar13._12_4_ * 3.0;
    auVar19._12_4_ = fVar366;
    fVar368 = fVar256 * auVar13._16_4_ * 3.0;
    auVar19._16_4_ = fVar368;
    fVar370 = fVar201 * auVar13._20_4_ * 3.0;
    auVar19._20_4_ = fVar370;
    fVar372 = fVar205 * auVar13._24_4_ * 3.0;
    auVar19._24_4_ = fVar372;
    auVar19._28_4_ = fVar374;
    fVar342 = fVar256 * auVar97._0_4_ * 3.0;
    fVar347 = fVar201 * auVar97._4_4_ * 3.0;
    auVar20._4_4_ = fVar347;
    auVar20._0_4_ = fVar342;
    fVar348 = fVar205 * auVar97._8_4_ * 3.0;
    auVar20._8_4_ = fVar348;
    fVar349 = fVar227 * auVar97._12_4_ * 3.0;
    auVar20._12_4_ = fVar349;
    fVar350 = fVar256 * auVar97._16_4_ * 3.0;
    auVar20._16_4_ = fVar350;
    fVar351 = fVar201 * auVar97._20_4_ * 3.0;
    auVar20._20_4_ = fVar351;
    fVar352 = fVar205 * auVar97._24_4_ * 3.0;
    auVar20._24_4_ = fVar352;
    auVar20._28_4_ = fVar353;
    fVar323 = fVar256 * auVar98._0_4_ * 3.0;
    fVar329 = fVar201 * auVar98._4_4_ * 3.0;
    local_680._4_4_ = fVar329;
    local_680._0_4_ = fVar323;
    fVar332 = fVar205 * auVar98._8_4_ * 3.0;
    local_680._8_4_ = fVar332;
    fVar334 = fVar227 * auVar98._12_4_ * 3.0;
    local_680._12_4_ = fVar334;
    fVar336 = fVar256 * auVar98._16_4_ * 3.0;
    local_680._16_4_ = fVar336;
    fVar338 = fVar201 * auVar98._20_4_ * 3.0;
    local_680._20_4_ = fVar338;
    fVar340 = fVar205 * auVar98._24_4_ * 3.0;
    local_680._24_4_ = fVar340;
    local_680._28_4_ = auVar326._28_4_;
    fVar223 = fVar256 * auVar134._0_4_ * 3.0;
    fVar252 = fVar201 * auVar134._4_4_ * 3.0;
    auVar12._4_4_ = fVar252;
    auVar12._0_4_ = fVar223;
    fVar199 = fVar205 * auVar134._8_4_ * 3.0;
    auVar12._8_4_ = fVar199;
    fVar227 = fVar227 * auVar134._12_4_ * 3.0;
    auVar12._12_4_ = fVar227;
    fVar256 = fVar256 * auVar134._16_4_ * 3.0;
    auVar12._16_4_ = fVar256;
    fVar201 = fVar201 * auVar134._20_4_ * 3.0;
    auVar12._20_4_ = fVar201;
    fVar205 = fVar205 * auVar134._24_4_ * 3.0;
    auVar12._24_4_ = fVar205;
    auVar12._28_4_ = auVar13._28_4_;
    auVar97 = vperm2f128_avx(auVar387,auVar387,1);
    auVar97 = vshufps_avx(auVar97,auVar387,0x30);
    auVar134 = vshufps_avx(auVar387,auVar97,0x29);
    auVar97 = vperm2f128_avx(auVar310,auVar310,1);
    auVar97 = vshufps_avx(auVar97,auVar310,0x30);
    _local_980 = vshufps_avx(auVar310,auVar97,0x29);
    auVar98 = vsubps_avx(_local_8a0,auVar12);
    auVar97 = vperm2f128_avx(auVar98,auVar98,1);
    auVar97 = vshufps_avx(auVar97,auVar98,0x30);
    auVar12 = vshufps_avx(auVar98,auVar97,0x29);
    auVar176 = vsubps_avx(auVar134,auVar387);
    auVar379 = vsubps_avx(_local_980,auVar310);
    fVar206 = auVar176._0_4_;
    fVar225 = auVar176._4_4_;
    auVar361._4_4_ = fVar329 * fVar225;
    auVar361._0_4_ = fVar323 * fVar206;
    fVar202 = auVar176._8_4_;
    auVar361._8_4_ = fVar332 * fVar202;
    fVar226 = auVar176._12_4_;
    auVar361._12_4_ = fVar334 * fVar226;
    fVar234 = auVar176._16_4_;
    auVar361._16_4_ = fVar336 * fVar234;
    fVar262 = auVar176._20_4_;
    auVar361._20_4_ = fVar338 * fVar262;
    fVar282 = auVar176._24_4_;
    auVar361._24_4_ = fVar340 * fVar282;
    auVar361._28_4_ = auVar98._28_4_;
    fVar233 = auVar379._0_4_;
    fVar254 = auVar379._4_4_;
    auVar14._4_4_ = fVar347 * fVar254;
    auVar14._0_4_ = fVar342 * fVar233;
    fVar203 = auVar379._8_4_;
    auVar14._8_4_ = fVar348 * fVar203;
    fVar228 = auVar379._12_4_;
    auVar14._12_4_ = fVar349 * fVar228;
    fVar253 = auVar379._16_4_;
    auVar14._16_4_ = fVar350 * fVar253;
    fVar263 = auVar379._20_4_;
    auVar14._20_4_ = fVar351 * fVar263;
    fVar284 = auVar379._24_4_;
    auVar14._24_4_ = fVar352 * fVar284;
    auVar14._28_4_ = auVar97._28_4_;
    auVar361 = vsubps_avx(auVar14,auVar361);
    auVar67._4_4_ = fVar109;
    auVar67._0_4_ = fVar80;
    auVar67._8_4_ = fVar112;
    auVar67._12_4_ = fVar115;
    auVar67._16_4_ = fStack_a90;
    auVar67._20_4_ = fStack_a8c;
    auVar67._24_4_ = fStack_a88;
    auVar67._28_4_ = fStack_a84;
    auVar97 = vperm2f128_avx(auVar67,auVar67,1);
    auVar97 = vshufps_avx(auVar97,auVar67,0x30);
    local_920 = vshufps_avx(auVar67,auVar97,0x29);
    auVar14 = vsubps_avx(local_920,auVar67);
    auVar15._4_4_ = fVar362 * fVar254;
    auVar15._0_4_ = fVar355 * fVar233;
    auVar15._8_4_ = fVar364 * fVar203;
    auVar15._12_4_ = fVar366 * fVar228;
    auVar15._16_4_ = fVar368 * fVar253;
    auVar15._20_4_ = fVar370 * fVar263;
    auVar15._24_4_ = fVar372 * fVar284;
    auVar15._28_4_ = local_920._28_4_;
    fVar198 = auVar14._0_4_;
    fVar200 = auVar14._4_4_;
    auVar16._4_4_ = fVar329 * fVar200;
    auVar16._0_4_ = fVar323 * fVar198;
    fVar204 = auVar14._8_4_;
    auVar16._8_4_ = fVar332 * fVar204;
    fVar229 = auVar14._12_4_;
    auVar16._12_4_ = fVar334 * fVar229;
    fVar255 = auVar14._16_4_;
    auVar16._16_4_ = fVar336 * fVar255;
    fVar265 = auVar14._20_4_;
    auVar16._20_4_ = fVar338 * fVar265;
    fVar286 = auVar14._24_4_;
    auVar16._24_4_ = fVar340 * fVar286;
    auVar16._28_4_ = auVar134._28_4_;
    auVar15 = vsubps_avx(auVar16,auVar15);
    auVar100._4_4_ = fVar347 * fVar200;
    auVar100._0_4_ = fVar342 * fVar198;
    auVar100._8_4_ = fVar348 * fVar204;
    auVar100._12_4_ = fVar349 * fVar229;
    auVar100._16_4_ = fVar350 * fVar255;
    auVar100._20_4_ = fVar351 * fVar265;
    auVar100._24_4_ = fVar352 * fVar286;
    auVar100._28_4_ = auVar134._28_4_;
    auVar17._4_4_ = fVar362 * fVar225;
    auVar17._0_4_ = fVar355 * fVar206;
    auVar17._8_4_ = fVar364 * fVar202;
    auVar17._12_4_ = fVar366 * fVar226;
    auVar17._16_4_ = fVar368 * fVar234;
    auVar17._20_4_ = fVar370 * fVar262;
    auVar17._24_4_ = fVar372 * fVar282;
    auVar17._28_4_ = auVar319._28_4_;
    auVar16 = vsubps_avx(auVar17,auVar100);
    fVar183 = auVar16._28_4_;
    auVar177._0_4_ = fVar198 * fVar198 + fVar206 * fVar206 + fVar233 * fVar233;
    auVar177._4_4_ = fVar200 * fVar200 + fVar225 * fVar225 + fVar254 * fVar254;
    auVar177._8_4_ = fVar204 * fVar204 + fVar202 * fVar202 + fVar203 * fVar203;
    auVar177._12_4_ = fVar229 * fVar229 + fVar226 * fVar226 + fVar228 * fVar228;
    auVar177._16_4_ = fVar255 * fVar255 + fVar234 * fVar234 + fVar253 * fVar253;
    auVar177._20_4_ = fVar265 * fVar265 + fVar262 * fVar262 + fVar263 * fVar263;
    auVar177._24_4_ = fVar286 * fVar286 + fVar282 * fVar282 + fVar284 * fVar284;
    auVar177._28_4_ = fVar183 + fVar183 + auVar361._28_4_;
    auVar97 = vrcpps_avx(auVar177);
    fVar207 = auVar97._0_4_;
    fVar224 = auVar97._4_4_;
    auVar18._4_4_ = fVar224 * auVar177._4_4_;
    auVar18._0_4_ = fVar207 * auVar177._0_4_;
    fVar231 = auVar97._8_4_;
    auVar18._8_4_ = fVar231 * auVar177._8_4_;
    fVar232 = auVar97._12_4_;
    auVar18._12_4_ = fVar232 * auVar177._12_4_;
    fVar230 = auVar97._16_4_;
    auVar18._16_4_ = fVar230 * auVar177._16_4_;
    fVar257 = auVar97._20_4_;
    auVar18._20_4_ = fVar257 * auVar177._20_4_;
    fVar259 = auVar97._24_4_;
    auVar18._24_4_ = fVar259 * auVar177._24_4_;
    auVar18._28_4_ = auVar319._28_4_;
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = &DAT_3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar100 = vsubps_avx(auVar99,auVar18);
    fVar207 = auVar100._0_4_ * fVar207 + fVar207;
    fVar224 = auVar100._4_4_ * fVar224 + fVar224;
    fVar231 = auVar100._8_4_ * fVar231 + fVar231;
    fVar232 = auVar100._12_4_ * fVar232 + fVar232;
    fVar230 = auVar100._16_4_ * fVar230 + fVar230;
    fVar257 = auVar100._20_4_ * fVar257 + fVar257;
    fVar259 = auVar100._24_4_ * fVar259 + fVar259;
    auVar98 = vperm2f128_avx(auVar20,auVar20,1);
    auVar98 = vshufps_avx(auVar98,auVar20,0x30);
    local_a40 = vshufps_avx(auVar20,auVar98,0x29);
    auVar98 = vperm2f128_avx(local_680,local_680,1);
    auVar98 = vshufps_avx(auVar98,local_680,0x30);
    local_880 = vshufps_avx(local_680,auVar98,0x29);
    fVar81 = local_880._0_4_;
    fVar110 = local_880._4_4_;
    auVar21._4_4_ = fVar110 * fVar225;
    auVar21._0_4_ = fVar81 * fVar206;
    fVar113 = local_880._8_4_;
    auVar21._8_4_ = fVar113 * fVar202;
    fVar116 = local_880._12_4_;
    auVar21._12_4_ = fVar116 * fVar226;
    fVar117 = local_880._16_4_;
    auVar21._16_4_ = fVar117 * fVar234;
    fVar118 = local_880._20_4_;
    auVar21._20_4_ = fVar118 * fVar262;
    fVar119 = local_880._24_4_;
    auVar21._24_4_ = fVar119 * fVar282;
    auVar21._28_4_ = auVar98._28_4_;
    fVar376 = local_a40._0_4_;
    fVar381 = local_a40._4_4_;
    auVar22._4_4_ = fVar381 * fVar254;
    auVar22._0_4_ = fVar376 * fVar233;
    fVar382 = local_a40._8_4_;
    auVar22._8_4_ = fVar382 * fVar203;
    fVar383 = local_a40._12_4_;
    auVar22._12_4_ = fVar383 * fVar228;
    fVar384 = local_a40._16_4_;
    auVar22._16_4_ = fVar384 * fVar253;
    fVar385 = local_a40._20_4_;
    auVar22._20_4_ = fVar385 * fVar263;
    fVar386 = local_a40._24_4_;
    auVar22._24_4_ = fVar386 * fVar284;
    auVar22._28_4_ = fVar353;
    auVar17 = vsubps_avx(auVar22,auVar21);
    auVar98 = vperm2f128_avx(auVar19,auVar19,1);
    auVar98 = vshufps_avx(auVar98,auVar19,0x30);
    local_860 = vshufps_avx(auVar19,auVar98,0x29);
    fVar324 = local_860._0_4_;
    fVar330 = local_860._4_4_;
    auVar23._4_4_ = fVar330 * fVar254;
    auVar23._0_4_ = fVar324 * fVar233;
    fVar333 = local_860._8_4_;
    auVar23._8_4_ = fVar333 * fVar203;
    fVar335 = local_860._12_4_;
    auVar23._12_4_ = fVar335 * fVar228;
    fVar337 = local_860._16_4_;
    auVar23._16_4_ = fVar337 * fVar253;
    fVar339 = local_860._20_4_;
    auVar23._20_4_ = fVar339 * fVar263;
    fVar341 = local_860._24_4_;
    auVar23._24_4_ = fVar341 * fVar284;
    auVar23._28_4_ = auVar98._28_4_;
    auVar24._4_4_ = fVar110 * fVar200;
    auVar24._0_4_ = fVar81 * fVar198;
    auVar24._8_4_ = fVar113 * fVar204;
    auVar24._12_4_ = fVar116 * fVar229;
    auVar24._16_4_ = fVar117 * fVar255;
    auVar24._20_4_ = fVar118 * fVar265;
    auVar24._24_4_ = fVar119 * fVar286;
    auVar24._28_4_ = fVar374;
    auVar98 = vsubps_avx(auVar24,auVar23);
    auVar25._4_4_ = fVar381 * fVar200;
    auVar25._0_4_ = fVar376 * fVar198;
    auVar25._8_4_ = fVar382 * fVar204;
    auVar25._12_4_ = fVar383 * fVar229;
    auVar25._16_4_ = fVar384 * fVar255;
    auVar25._20_4_ = fVar385 * fVar265;
    auVar25._24_4_ = fVar386 * fVar286;
    auVar25._28_4_ = fVar374;
    auVar26._4_4_ = fVar330 * fVar225;
    auVar26._0_4_ = fVar324 * fVar206;
    auVar26._8_4_ = fVar333 * fVar202;
    auVar26._12_4_ = fVar335 * fVar226;
    auVar26._16_4_ = fVar337 * fVar234;
    auVar26._20_4_ = fVar339 * fVar262;
    auVar26._24_4_ = fVar341 * fVar282;
    auVar26._28_4_ = local_a40._28_4_;
    auVar18 = vsubps_avx(auVar26,auVar25);
    fVar264 = auVar18._28_4_;
    fVar354 = auVar98._28_4_ + fVar264;
    auVar27._4_4_ =
         (auVar361._4_4_ * auVar361._4_4_ +
         auVar15._4_4_ * auVar15._4_4_ + auVar16._4_4_ * auVar16._4_4_) * fVar224;
    auVar27._0_4_ =
         (auVar361._0_4_ * auVar361._0_4_ +
         auVar15._0_4_ * auVar15._0_4_ + auVar16._0_4_ * auVar16._0_4_) * fVar207;
    auVar27._8_4_ =
         (auVar361._8_4_ * auVar361._8_4_ +
         auVar15._8_4_ * auVar15._8_4_ + auVar16._8_4_ * auVar16._8_4_) * fVar231;
    auVar27._12_4_ =
         (auVar361._12_4_ * auVar361._12_4_ +
         auVar15._12_4_ * auVar15._12_4_ + auVar16._12_4_ * auVar16._12_4_) * fVar232;
    auVar27._16_4_ =
         (auVar361._16_4_ * auVar361._16_4_ +
         auVar15._16_4_ * auVar15._16_4_ + auVar16._16_4_ * auVar16._16_4_) * fVar230;
    auVar27._20_4_ =
         (auVar361._20_4_ * auVar361._20_4_ +
         auVar15._20_4_ * auVar15._20_4_ + auVar16._20_4_ * auVar16._20_4_) * fVar257;
    auVar27._24_4_ =
         (auVar361._24_4_ * auVar361._24_4_ +
         auVar15._24_4_ * auVar15._24_4_ + auVar16._24_4_ * auVar16._24_4_) * fVar259;
    auVar27._28_4_ = auVar361._28_4_ + auVar15._28_4_ + fVar183;
    auVar28._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar98._4_4_ * auVar98._4_4_ + auVar18._4_4_ * auVar18._4_4_) * fVar224;
    auVar28._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar98._0_4_ * auVar98._0_4_ + auVar18._0_4_ * auVar18._0_4_) * fVar207;
    auVar28._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar98._8_4_ * auVar98._8_4_ + auVar18._8_4_ * auVar18._8_4_) * fVar231;
    auVar28._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar98._12_4_ * auVar98._12_4_ + auVar18._12_4_ * auVar18._12_4_) * fVar232;
    auVar28._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar98._16_4_ * auVar98._16_4_ + auVar18._16_4_ * auVar18._16_4_) * fVar230;
    auVar28._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar98._20_4_ * auVar98._20_4_ + auVar18._20_4_ * auVar18._20_4_) * fVar257;
    auVar28._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar98._24_4_ * auVar98._24_4_ + auVar18._24_4_ * auVar18._24_4_) * fVar259;
    auVar28._28_4_ = auVar100._28_4_ + auVar97._28_4_;
    auVar97 = vmaxps_avx(auVar27,auVar28);
    auVar98 = vperm2f128_avx(_local_8a0,_local_8a0,1);
    auVar98 = vshufps_avx(auVar98,_local_8a0,0x30);
    local_7e0 = vshufps_avx(_local_8a0,auVar98,0x29);
    local_6c0._0_4_ = (float)local_8a0._0_4_ + fVar223;
    local_6c0._4_4_ = (float)local_8a0._4_4_ + fVar252;
    local_6c0._8_4_ = fStack_898 + fVar199;
    local_6c0._12_4_ = fStack_894 + fVar227;
    local_6c0._16_4_ = fStack_890 + fVar256;
    local_6c0._20_4_ = fStack_88c + fVar201;
    local_6c0._24_4_ = fStack_888 + fVar205;
    local_6c0._28_4_ = fStack_884 + auVar13._28_4_;
    auVar98 = vmaxps_avx(_local_8a0,local_6c0);
    auVar13 = vmaxps_avx(auVar12,local_7e0);
    auVar98 = vmaxps_avx(auVar98,auVar13);
    auVar13 = vrsqrtps_avx(auVar177);
    fVar183 = auVar13._0_4_;
    fVar223 = auVar13._4_4_;
    fVar252 = auVar13._8_4_;
    fVar199 = auVar13._12_4_;
    fVar227 = auVar13._16_4_;
    fVar256 = auVar13._20_4_;
    fVar201 = auVar13._24_4_;
    fVar294 = fVar183 * 1.5 + fVar183 * fVar183 * fVar183 * auVar177._0_4_ * -0.5;
    fVar301 = fVar223 * 1.5 + fVar223 * fVar223 * fVar223 * auVar177._4_4_ * -0.5;
    fVar302 = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar177._8_4_ * -0.5;
    fVar303 = fVar199 * 1.5 + fVar199 * fVar199 * fVar199 * auVar177._12_4_ * -0.5;
    fVar304 = fVar227 * 1.5 + fVar227 * fVar227 * fVar227 * auVar177._16_4_ * -0.5;
    fVar305 = fVar256 * 1.5 + fVar256 * fVar256 * fVar256 * auVar177._20_4_ * -0.5;
    fVar306 = fVar201 * 1.5 + fVar201 * fVar201 * fVar201 * auVar177._24_4_ * -0.5;
    auVar361 = vsubps_avx(ZEXT832(0) << 0x20,auVar387);
    auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar310);
    fVar223 = auVar15._0_4_;
    fVar227 = auVar15._4_4_;
    fVar205 = auVar15._8_4_;
    fVar231 = auVar15._12_4_;
    fVar257 = auVar15._16_4_;
    fVar277 = auVar15._20_4_;
    fVar258 = auVar15._24_4_;
    fVar252 = auVar361._0_4_;
    fVar256 = auVar361._4_4_;
    fVar207 = auVar361._8_4_;
    fVar232 = auVar361._12_4_;
    fVar259 = auVar361._16_4_;
    fVar278 = auVar361._20_4_;
    fVar353 = auVar361._24_4_;
    auVar68._4_4_ = fVar109;
    auVar68._0_4_ = fVar80;
    auVar68._8_4_ = fVar112;
    auVar68._12_4_ = fVar115;
    auVar68._16_4_ = fStack_a90;
    auVar68._20_4_ = fStack_a8c;
    auVar68._24_4_ = fStack_a88;
    auVar68._28_4_ = fStack_a84;
    auVar100 = ZEXT832(0) << 0x20;
    auVar16 = vsubps_avx(auVar100,auVar68);
    fVar199 = auVar16._0_4_;
    fVar201 = auVar16._4_4_;
    fVar224 = auVar16._8_4_;
    fVar230 = auVar16._12_4_;
    fVar260 = auVar16._16_4_;
    fVar280 = auVar16._20_4_;
    fVar261 = auVar16._24_4_;
    auVar320._0_4_ = local_5a0 * fVar199 + local_4a0 * fVar252 + local_480 * fVar223;
    auVar320._4_4_ = fStack_59c * fVar201 + fStack_49c * fVar256 + fStack_47c * fVar227;
    auVar320._8_4_ = fStack_598 * fVar224 + fStack_498 * fVar207 + fStack_478 * fVar205;
    auVar320._12_4_ = fStack_594 * fVar230 + fStack_494 * fVar232 + fStack_474 * fVar231;
    auVar320._16_4_ = fStack_590 * fVar260 + fStack_490 * fVar259 + fStack_470 * fVar257;
    auVar320._20_4_ = fStack_58c * fVar280 + fStack_48c * fVar278 + fStack_46c * fVar277;
    auVar320._24_4_ = fStack_588 * fVar261 + fStack_488 * fVar353 + fStack_468 * fVar258;
    auVar320._28_4_ = fVar354 + auVar17._28_4_ + fVar354 + 1.5;
    auVar344._0_4_ = fVar199 * fVar199 + fVar252 * fVar252 + fVar223 * fVar223;
    auVar344._4_4_ = fVar201 * fVar201 + fVar256 * fVar256 + fVar227 * fVar227;
    auVar344._8_4_ = fVar224 * fVar224 + fVar207 * fVar207 + fVar205 * fVar205;
    auVar344._12_4_ = fVar230 * fVar230 + fVar232 * fVar232 + fVar231 * fVar231;
    auVar344._16_4_ = fVar260 * fVar260 + fVar259 * fVar259 + fVar257 * fVar257;
    auVar344._20_4_ = fVar280 * fVar280 + fVar278 * fVar278 + fVar277 * fVar277;
    auVar344._24_4_ = fVar261 * fVar261 + fVar353 * fVar353 + fVar258 * fVar258;
    auVar344._28_4_ = fVar264 + fVar264 + fVar354;
    fVar183 = auVar176._28_4_;
    fVar307 = local_5a0 * fVar294 * fVar198 +
              local_4a0 * fVar294 * fVar206 + local_480 * fVar294 * fVar233;
    fVar312 = fStack_59c * fVar301 * fVar200 +
              fStack_49c * fVar301 * fVar225 + fStack_47c * fVar301 * fVar254;
    fVar313 = fStack_598 * fVar302 * fVar204 +
              fStack_498 * fVar302 * fVar202 + fStack_478 * fVar302 * fVar203;
    fVar314 = fStack_594 * fVar303 * fVar229 +
              fStack_494 * fVar303 * fVar226 + fStack_474 * fVar303 * fVar228;
    fVar315 = fStack_590 * fVar304 * fVar255 +
              fStack_490 * fVar304 * fVar234 + fStack_470 * fVar304 * fVar253;
    fVar316 = fStack_58c * fVar305 * fVar265 +
              fStack_48c * fVar305 * fVar262 + fStack_46c * fVar305 * fVar263;
    fVar317 = fStack_588 * fVar306 * fVar286 +
              fStack_488 * fVar306 * fVar282 + fStack_468 * fVar306 * fVar284;
    fVar264 = auVar14._28_4_ + fVar183 + auVar379._28_4_;
    fVar356 = fVar199 * fVar294 * fVar198 +
              fVar294 * fVar206 * fVar252 + fVar294 * fVar233 * fVar223;
    fVar363 = fVar201 * fVar301 * fVar200 +
              fVar301 * fVar225 * fVar256 + fVar301 * fVar254 * fVar227;
    fVar365 = fVar224 * fVar302 * fVar204 +
              fVar302 * fVar202 * fVar207 + fVar302 * fVar203 * fVar205;
    fVar367 = fVar230 * fVar303 * fVar229 +
              fVar303 * fVar226 * fVar232 + fVar303 * fVar228 * fVar231;
    fVar369 = fVar260 * fVar304 * fVar255 +
              fVar304 * fVar234 * fVar259 + fVar304 * fVar253 * fVar257;
    fVar371 = fVar280 * fVar305 * fVar265 +
              fVar305 * fVar262 * fVar278 + fVar305 * fVar263 * fVar277;
    fVar373 = fVar261 * fVar306 * fVar286 +
              fVar306 * fVar282 * fVar353 + fVar306 * fVar284 * fVar258;
    fVar375 = fVar183 + fVar264;
    auVar13._4_4_ = fVar312 * fVar363;
    auVar13._0_4_ = fVar307 * fVar356;
    auVar13._8_4_ = fVar313 * fVar365;
    auVar13._12_4_ = fVar314 * fVar367;
    auVar13._16_4_ = fVar315 * fVar369;
    auVar13._20_4_ = fVar316 * fVar371;
    auVar13._24_4_ = fVar317 * fVar373;
    auVar13._28_4_ = fVar264;
    auVar176 = vsubps_avx(auVar320,auVar13);
    auVar379._4_4_ = fVar363 * fVar363;
    auVar379._0_4_ = fVar356 * fVar356;
    auVar379._8_4_ = fVar365 * fVar365;
    auVar379._12_4_ = fVar367 * fVar367;
    auVar379._16_4_ = fVar369 * fVar369;
    auVar379._20_4_ = fVar371 * fVar371;
    auVar379._24_4_ = fVar373 * fVar373;
    auVar379._28_4_ = fVar183;
    local_6e0 = vsubps_avx(auVar344,auVar379);
    auVar13 = vsqrtps_avx(auVar97);
    fVar183 = (auVar13._0_4_ + auVar98._0_4_) * 1.0000002;
    fVar264 = (auVar13._4_4_ + auVar98._4_4_) * 1.0000002;
    fVar354 = (auVar13._8_4_ + auVar98._8_4_) * 1.0000002;
    fVar158 = (auVar13._12_4_ + auVar98._12_4_) * 1.0000002;
    fVar160 = (auVar13._16_4_ + auVar98._16_4_) * 1.0000002;
    fVar162 = (auVar13._20_4_ + auVar98._20_4_) * 1.0000002;
    fVar164 = (auVar13._24_4_ + auVar98._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar264 * fVar264;
    auVar29._0_4_ = fVar183 * fVar183;
    auVar29._8_4_ = fVar354 * fVar354;
    auVar29._12_4_ = fVar158 * fVar158;
    auVar29._16_4_ = fVar160 * fVar160;
    auVar29._20_4_ = fVar162 * fVar162;
    auVar29._24_4_ = fVar164 * fVar164;
    auVar29._28_4_ = auVar13._28_4_ + auVar98._28_4_;
    fVar325 = auVar176._0_4_ + auVar176._0_4_;
    fVar331 = auVar176._4_4_ + auVar176._4_4_;
    auVar327._0_8_ = CONCAT44(fVar331,fVar325);
    auVar327._8_4_ = auVar176._8_4_ + auVar176._8_4_;
    auVar327._12_4_ = auVar176._12_4_ + auVar176._12_4_;
    auVar327._16_4_ = auVar176._16_4_ + auVar176._16_4_;
    auVar327._20_4_ = auVar176._20_4_ + auVar176._20_4_;
    auVar327._24_4_ = auVar176._24_4_ + auVar176._24_4_;
    auVar327._28_4_ = auVar176._28_4_ + auVar176._28_4_;
    auVar98 = vsubps_avx(local_6e0,auVar29);
    auVar30._4_4_ = fVar312 * fVar312;
    auVar30._0_4_ = fVar307 * fVar307;
    auVar30._8_4_ = fVar313 * fVar313;
    auVar30._12_4_ = fVar314 * fVar314;
    auVar30._16_4_ = fVar315 * fVar315;
    auVar30._20_4_ = fVar316 * fVar316;
    auVar30._24_4_ = fVar317 * fVar317;
    auVar30._28_4_ = auVar320._28_4_;
    auVar176 = vsubps_avx(local_220,auVar30);
    local_700._4_4_ = fVar331 * fVar331;
    local_700._0_4_ = fVar325 * fVar325;
    local_700._8_4_ = auVar327._8_4_ * auVar327._8_4_;
    local_700._12_4_ = auVar327._12_4_ * auVar327._12_4_;
    local_700._16_4_ = auVar327._16_4_ * auVar327._16_4_;
    local_700._20_4_ = auVar327._20_4_ * auVar327._20_4_;
    local_700._24_4_ = auVar327._24_4_ * auVar327._24_4_;
    local_700._28_4_ = 0x3f800002;
    fVar264 = auVar176._0_4_;
    local_720 = fVar264 * 4.0;
    fVar354 = auVar176._4_4_;
    fStack_71c = fVar354 * 4.0;
    fVar158 = auVar176._8_4_;
    fStack_718 = fVar158 * 4.0;
    fVar160 = auVar176._12_4_;
    fStack_714 = fVar160 * 4.0;
    fVar162 = auVar176._16_4_;
    fStack_710 = fVar162 * 4.0;
    fVar164 = auVar176._20_4_;
    fStack_70c = fVar164 * 4.0;
    fVar318 = auVar176._24_4_;
    fStack_708 = fVar318 * 4.0;
    fStack_704 = 4.0;
    auVar31._4_4_ = auVar98._4_4_ * fStack_71c;
    auVar31._0_4_ = auVar98._0_4_ * local_720;
    auVar31._8_4_ = auVar98._8_4_ * fStack_718;
    auVar31._12_4_ = auVar98._12_4_ * fStack_714;
    auVar31._16_4_ = auVar98._16_4_ * fStack_710;
    auVar31._20_4_ = auVar98._20_4_ * fStack_70c;
    auVar31._24_4_ = auVar98._24_4_ * fStack_708;
    auVar31._28_4_ = 0x40800000;
    auVar379 = vsubps_avx(local_700,auVar31);
    auVar97 = vcmpps_avx(auVar379,auVar100,5);
    auVar276 = ZEXT3264(auVar97);
    fVar183 = auVar176._28_4_;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar135._8_4_ = 0x7f800000;
      auVar135._0_8_ = 0x7f8000007f800000;
      auVar135._12_4_ = 0x7f800000;
      auVar135._16_4_ = 0x7f800000;
      auVar135._20_4_ = 0x7f800000;
      auVar135._24_4_ = 0x7f800000;
      auVar135._28_4_ = 0x7f800000;
      auVar345._8_4_ = 0xff800000;
      auVar345._0_8_ = 0xff800000ff800000;
      auVar345._12_4_ = 0xff800000;
      auVar345._16_4_ = 0xff800000;
      auVar345._20_4_ = 0xff800000;
      auVar345._24_4_ = 0xff800000;
      auVar345._28_4_ = 0xff800000;
      auVar377._4_4_ = fStack_59c;
      auVar377._0_4_ = local_5a0;
      auVar377._8_4_ = fStack_598;
      auVar377._12_4_ = fStack_594;
      auVar377._16_4_ = fStack_590;
      auVar377._20_4_ = fStack_58c;
      auVar377._24_4_ = fStack_588;
    }
    else {
      auVar18 = vsqrtps_avx(auVar379);
      auVar270._0_4_ = fVar264 + fVar264;
      auVar270._4_4_ = fVar354 + fVar354;
      auVar270._8_4_ = fVar158 + fVar158;
      auVar270._12_4_ = fVar160 + fVar160;
      auVar270._16_4_ = fVar162 + fVar162;
      auVar270._20_4_ = fVar164 + fVar164;
      auVar270._24_4_ = fVar318 + fVar318;
      auVar270._28_4_ = fVar183 + fVar183;
      auVar17 = vrcpps_avx(auVar270);
      auVar14 = vcmpps_avx(auVar379,auVar100,5);
      fVar121 = auVar17._0_4_;
      fVar153 = auVar17._4_4_;
      auVar32._4_4_ = auVar270._4_4_ * fVar153;
      auVar32._0_4_ = auVar270._0_4_ * fVar121;
      fVar155 = auVar17._8_4_;
      auVar32._8_4_ = auVar270._8_4_ * fVar155;
      fVar159 = auVar17._12_4_;
      auVar32._12_4_ = auVar270._12_4_ * fVar159;
      fVar161 = auVar17._16_4_;
      auVar32._16_4_ = auVar270._16_4_ * fVar161;
      fVar163 = auVar17._20_4_;
      auVar32._20_4_ = auVar270._20_4_ * fVar163;
      fVar165 = auVar17._24_4_;
      auVar32._24_4_ = auVar270._24_4_ * fVar165;
      auVar32._28_4_ = auVar379._28_4_;
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar101._16_4_ = 0x3f800000;
      auVar101._20_4_ = 0x3f800000;
      auVar101._24_4_ = 0x3f800000;
      auVar101._28_4_ = 0x3f800000;
      auVar379 = vsubps_avx(auVar101,auVar32);
      fVar121 = fVar121 + fVar121 * auVar379._0_4_;
      fVar153 = fVar153 + fVar153 * auVar379._4_4_;
      fVar155 = fVar155 + fVar155 * auVar379._8_4_;
      fVar159 = fVar159 + fVar159 * auVar379._12_4_;
      fVar161 = fVar161 + fVar161 * auVar379._16_4_;
      fVar163 = fVar163 + fVar163 * auVar379._20_4_;
      fVar165 = fVar165 + fVar165 * auVar379._24_4_;
      auVar271._0_8_ = CONCAT44(fVar331,fVar325) ^ 0x8000000080000000;
      auVar271._8_4_ = -auVar327._8_4_;
      auVar271._12_4_ = -auVar327._12_4_;
      auVar271._16_4_ = -auVar327._16_4_;
      auVar271._20_4_ = -auVar327._20_4_;
      auVar271._24_4_ = -auVar327._24_4_;
      auVar271._28_4_ = -auVar327._28_4_;
      auVar100 = vsubps_avx(auVar271,auVar18);
      fVar325 = auVar100._0_4_ * fVar121;
      fVar331 = auVar100._4_4_ * fVar153;
      auVar33._4_4_ = fVar331;
      auVar33._0_4_ = fVar325;
      fVar279 = auVar100._8_4_ * fVar155;
      auVar33._8_4_ = fVar279;
      fVar281 = auVar100._12_4_ * fVar159;
      auVar33._12_4_ = fVar281;
      fVar283 = auVar100._16_4_ * fVar161;
      auVar33._16_4_ = fVar283;
      fVar285 = auVar100._20_4_ * fVar163;
      auVar33._20_4_ = fVar285;
      fVar287 = auVar100._24_4_ * fVar165;
      auVar33._24_4_ = fVar287;
      auVar33._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar18,auVar327);
      fVar121 = auVar100._0_4_ * fVar121;
      fVar153 = auVar100._4_4_ * fVar153;
      auVar34._4_4_ = fVar153;
      auVar34._0_4_ = fVar121;
      fVar155 = auVar100._8_4_ * fVar155;
      auVar34._8_4_ = fVar155;
      fVar159 = auVar100._12_4_ * fVar159;
      auVar34._12_4_ = fVar159;
      fVar161 = auVar100._16_4_ * fVar161;
      auVar34._16_4_ = fVar161;
      fVar163 = auVar100._20_4_ * fVar163;
      auVar34._20_4_ = fVar163;
      fVar165 = auVar100._24_4_ * fVar165;
      auVar34._24_4_ = fVar165;
      auVar34._28_4_ = auVar100._28_4_;
      fStack_404 = fVar375 + auVar17._28_4_ + auVar379._28_4_;
      local_420[0] = fVar294 * (fVar356 + fVar307 * fVar325);
      local_420[1] = fVar301 * (fVar363 + fVar312 * fVar331);
      local_420[2] = fVar302 * (fVar365 + fVar313 * fVar279);
      local_420[3] = fVar303 * (fVar367 + fVar314 * fVar281);
      fStack_410 = fVar304 * (fVar369 + fVar315 * fVar283);
      fStack_40c = fVar305 * (fVar371 + fVar316 * fVar285);
      fStack_408 = fVar306 * (fVar373 + fVar317 * fVar287);
      local_440[0] = fVar294 * (fVar356 + fVar307 * fVar121);
      local_440[1] = fVar301 * (fVar363 + fVar312 * fVar153);
      local_440[2] = fVar302 * (fVar365 + fVar313 * fVar155);
      local_440[3] = fVar303 * (fVar367 + fVar314 * fVar159);
      fStack_430 = fVar304 * (fVar369 + fVar315 * fVar161);
      fStack_42c = fVar305 * (fVar371 + fVar316 * fVar163);
      fStack_428 = fVar306 * (fVar373 + fVar317 * fVar165);
      fStack_424 = fVar375 + fStack_404;
      auVar136._8_4_ = 0x7f800000;
      auVar136._0_8_ = 0x7f8000007f800000;
      auVar136._12_4_ = 0x7f800000;
      auVar136._16_4_ = 0x7f800000;
      auVar136._20_4_ = 0x7f800000;
      auVar136._24_4_ = 0x7f800000;
      auVar136._28_4_ = 0x7f800000;
      auVar135 = vblendvps_avx(auVar136,auVar33,auVar14);
      auVar289._8_4_ = 0x7fffffff;
      auVar289._0_8_ = 0x7fffffff7fffffff;
      auVar289._12_4_ = 0x7fffffff;
      auVar289._16_4_ = 0x7fffffff;
      auVar289._20_4_ = 0x7fffffff;
      auVar289._24_4_ = 0x7fffffff;
      auVar289._28_4_ = 0x7fffffff;
      auVar379 = vandps_avx(auVar30,auVar289);
      auVar379 = vmaxps_avx(local_360,auVar379);
      auVar35._4_4_ = auVar379._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar379._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar379._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar379._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar379._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar379._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar379._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar379._28_4_;
      auVar379 = vandps_avx(auVar176,auVar289);
      auVar379 = vcmpps_avx(auVar379,auVar35,1);
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar345 = vblendvps_avx(auVar272,auVar34,auVar14);
      auVar100 = auVar14 & auVar379;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar100[0x1f]) {
        auVar377._4_4_ = fStack_59c;
        auVar377._0_4_ = local_5a0;
        auVar377._8_4_ = fStack_598;
        auVar377._12_4_ = fStack_594;
        auVar377._16_4_ = fStack_590;
        auVar377._20_4_ = fStack_58c;
        auVar377._24_4_ = fStack_588;
        auVar276 = ZEXT3264(auVar97);
      }
      else {
        auVar97 = vandps_avx(auVar379,auVar14);
        auVar133 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar379 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
        auVar360._8_4_ = 0xff800000;
        auVar360._0_8_ = 0xff800000ff800000;
        auVar360._12_4_ = 0xff800000;
        auVar360._16_4_ = 0xff800000;
        auVar360._20_4_ = 0xff800000;
        auVar360._24_4_ = 0xff800000;
        auVar360._28_4_ = 0xff800000;
        auVar300._8_4_ = 0x7f800000;
        auVar300._0_8_ = 0x7f8000007f800000;
        auVar300._12_4_ = 0x7f800000;
        auVar300._16_4_ = 0x7f800000;
        auVar300._20_4_ = 0x7f800000;
        auVar300._24_4_ = 0x7f800000;
        auVar300._28_4_ = 0x7f800000;
        auVar98 = vblendvps_avx(auVar300,auVar360,auVar379);
        auVar92 = vpmovsxwd_avx(auVar133);
        auVar133 = vpunpckhwd_avx(auVar133,auVar133);
        auVar275._16_16_ = auVar133;
        auVar275._0_16_ = auVar92;
        auVar135 = vblendvps_avx(auVar135,auVar98,auVar275);
        auVar98 = vblendvps_avx(auVar360,auVar300,auVar379);
        auVar345 = vblendvps_avx(auVar345,auVar98,auVar275);
        auVar98 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar249._0_4_ = auVar97._0_4_ ^ auVar98._0_4_;
        auVar249._4_4_ = auVar97._4_4_ ^ auVar98._4_4_;
        auVar249._8_4_ = auVar97._8_4_ ^ auVar98._8_4_;
        auVar249._12_4_ = auVar97._12_4_ ^ auVar98._12_4_;
        auVar249._16_4_ = auVar97._16_4_ ^ auVar98._16_4_;
        auVar249._20_4_ = auVar97._20_4_ ^ auVar98._20_4_;
        auVar249._24_4_ = auVar97._24_4_ ^ auVar98._24_4_;
        auVar249._28_4_ = auVar97._28_4_ ^ auVar98._28_4_;
        auVar97 = vorps_avx(auVar379,auVar249);
        auVar97 = vandps_avx(auVar14,auVar97);
        auVar276 = ZEXT3264(auVar97);
        auVar377._4_4_ = fStack_59c;
        auVar377._0_4_ = local_5a0;
        auVar377._8_4_ = fStack_598;
        auVar377._12_4_ = fStack_594;
        auVar377._16_4_ = fStack_590;
        auVar377._20_4_ = fStack_58c;
        auVar377._24_4_ = fStack_588;
      }
    }
    auVar322 = ZEXT3264(local_a20);
    auVar250 = ZEXT3264(local_340);
    auVar98 = auVar276._0_32_;
    auVar97 = local_340 & auVar98;
    auVar293 = ZEXT3264(local_800);
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar328 = ZEXT3264(local_900);
    }
    else {
      auVar133 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_790._0_4_));
      auVar133 = vshufps_avx(auVar133,auVar133,0);
      auVar241._16_16_ = auVar133;
      auVar241._0_16_ = auVar133;
      auVar14 = vmaxps_avx(auVar241,auVar135);
      auVar133 = ZEXT416((uint)(ray->tfar - (float)local_790._0_4_));
      auVar133 = vshufps_avx(auVar133,auVar133,0);
      auVar242._16_16_ = auVar133;
      auVar242._0_16_ = auVar133;
      auVar100 = vminps_avx(auVar242,auVar345);
      fVar161 = auVar15._28_4_;
      fVar163 = auVar377._0_4_;
      fVar165 = auVar377._4_4_;
      fVar279 = auVar377._8_4_;
      fVar281 = auVar377._12_4_;
      fVar283 = auVar377._16_4_;
      fVar285 = auVar377._20_4_;
      fVar287 = auVar377._24_4_;
      auVar102._0_4_ = fVar163 * fVar355 + local_4a0 * fVar342 + local_480 * fVar323;
      auVar102._4_4_ = fVar165 * fVar362 + fStack_49c * fVar347 + fStack_47c * fVar329;
      auVar102._8_4_ = fVar279 * fVar364 + fStack_498 * fVar348 + fStack_478 * fVar332;
      auVar102._12_4_ = fVar281 * fVar366 + fStack_494 * fVar349 + fStack_474 * fVar334;
      auVar102._16_4_ = fVar283 * fVar368 + fStack_490 * fVar350 + fStack_470 * fVar336;
      auVar102._20_4_ = fVar285 * fVar370 + fStack_48c * fVar351 + fStack_46c * fVar338;
      auVar102._24_4_ = fVar287 * fVar372 + fStack_488 * fVar352 + fStack_468 * fVar340;
      auVar102._28_4_ = fVar374 + auVar16._28_4_ + fVar161;
      auVar97 = vrcpps_avx(auVar102);
      fVar325 = auVar97._0_4_;
      fVar331 = auVar97._4_4_;
      auVar36._4_4_ = auVar102._4_4_ * fVar331;
      auVar36._0_4_ = auVar102._0_4_ * fVar325;
      fVar374 = auVar97._8_4_;
      auVar36._8_4_ = auVar102._8_4_ * fVar374;
      fVar121 = auVar97._12_4_;
      auVar36._12_4_ = auVar102._12_4_ * fVar121;
      fVar153 = auVar97._16_4_;
      auVar36._16_4_ = auVar102._16_4_ * fVar153;
      fVar155 = auVar97._20_4_;
      auVar36._20_4_ = auVar102._20_4_ * fVar155;
      fVar159 = auVar97._24_4_;
      auVar36._24_4_ = auVar102._24_4_ * fVar159;
      auVar36._28_4_ = auVar16._28_4_;
      auVar311._8_4_ = 0x3f800000;
      auVar311._0_8_ = &DAT_3f8000003f800000;
      auVar311._12_4_ = 0x3f800000;
      auVar311._16_4_ = 0x3f800000;
      auVar311._20_4_ = 0x3f800000;
      auVar311._24_4_ = 0x3f800000;
      auVar311._28_4_ = 0x3f800000;
      auVar379 = vsubps_avx(auVar311,auVar36);
      auVar290._8_4_ = 0x7fffffff;
      auVar290._0_8_ = 0x7fffffff7fffffff;
      auVar290._12_4_ = 0x7fffffff;
      auVar290._16_4_ = 0x7fffffff;
      auVar290._20_4_ = 0x7fffffff;
      auVar290._24_4_ = 0x7fffffff;
      auVar290._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(auVar102,auVar290);
      auVar346._8_4_ = 0x219392ef;
      auVar346._0_8_ = 0x219392ef219392ef;
      auVar346._12_4_ = 0x219392ef;
      auVar346._16_4_ = 0x219392ef;
      auVar346._20_4_ = 0x219392ef;
      auVar346._24_4_ = 0x219392ef;
      auVar346._28_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar97,auVar346,1);
      auVar37._4_4_ =
           (fVar331 + fVar331 * auVar379._4_4_) *
           -(fVar201 * fVar362 + fVar256 * fVar347 + fVar227 * fVar329);
      auVar37._0_4_ =
           (fVar325 + fVar325 * auVar379._0_4_) *
           -(fVar199 * fVar355 + fVar252 * fVar342 + fVar223 * fVar323);
      auVar37._8_4_ =
           (fVar374 + fVar374 * auVar379._8_4_) *
           -(fVar224 * fVar364 + fVar207 * fVar348 + fVar205 * fVar332);
      auVar37._12_4_ =
           (fVar121 + fVar121 * auVar379._12_4_) *
           -(fVar230 * fVar366 + fVar232 * fVar349 + fVar231 * fVar334);
      auVar37._16_4_ =
           (fVar153 + fVar153 * auVar379._16_4_) *
           -(fVar260 * fVar368 + fVar259 * fVar350 + fVar257 * fVar336);
      auVar37._20_4_ =
           (fVar155 + fVar155 * auVar379._20_4_) *
           -(fVar280 * fVar370 + fVar278 * fVar351 + fVar277 * fVar338);
      auVar37._24_4_ =
           (fVar159 + fVar159 * auVar379._24_4_) *
           -(fVar261 * fVar372 + fVar353 * fVar352 + fVar258 * fVar340);
      auVar37._28_4_ = -(fVar161 + auVar361._28_4_ + fVar161);
      auVar379 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,1);
      auVar361 = vorps_avx(auVar97,auVar379);
      auVar379 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,6);
      auVar379 = vorps_avx(auVar97,auVar379);
      auVar299._8_4_ = 0xff800000;
      auVar299._0_8_ = 0xff800000ff800000;
      auVar299._12_4_ = 0xff800000;
      auVar299._16_4_ = 0xff800000;
      auVar299._20_4_ = 0xff800000;
      auVar299._24_4_ = 0xff800000;
      auVar299._28_4_ = 0xff800000;
      auVar97 = vblendvps_avx(auVar37,auVar299,auVar361);
      auVar321._8_4_ = 0x7f800000;
      auVar321._0_8_ = 0x7f8000007f800000;
      auVar321._12_4_ = 0x7f800000;
      auVar321._16_4_ = 0x7f800000;
      auVar321._20_4_ = 0x7f800000;
      auVar321._24_4_ = 0x7f800000;
      auVar321._28_4_ = 0x7f800000;
      auVar379 = vblendvps_avx(auVar37,auVar321,auVar379);
      auVar361 = vmaxps_avx(auVar14,auVar97);
      auVar379 = vminps_avx(auVar100,auVar379);
      auVar100 = ZEXT832(0) << 0x20;
      auVar97 = vsubps_avx(auVar100,auVar134);
      auVar134 = vsubps_avx(auVar100,_local_980);
      auVar38._4_4_ = auVar134._4_4_ * -fVar110;
      auVar38._0_4_ = auVar134._0_4_ * -fVar81;
      auVar38._8_4_ = auVar134._8_4_ * -fVar113;
      auVar38._12_4_ = auVar134._12_4_ * -fVar116;
      auVar38._16_4_ = auVar134._16_4_ * -fVar117;
      auVar38._20_4_ = auVar134._20_4_ * -fVar118;
      auVar38._24_4_ = auVar134._24_4_ * -fVar119;
      auVar38._28_4_ = auVar134._28_4_;
      auVar39._4_4_ = fVar381 * auVar97._4_4_;
      auVar39._0_4_ = fVar376 * auVar97._0_4_;
      auVar39._8_4_ = fVar382 * auVar97._8_4_;
      auVar39._12_4_ = fVar383 * auVar97._12_4_;
      auVar39._16_4_ = fVar384 * auVar97._16_4_;
      auVar39._20_4_ = fVar385 * auVar97._20_4_;
      auVar39._24_4_ = fVar386 * auVar97._24_4_;
      auVar39._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(auVar38,auVar39);
      auVar134 = vsubps_avx(auVar100,local_920);
      auVar40._4_4_ = fVar330 * auVar134._4_4_;
      auVar40._0_4_ = fVar324 * auVar134._0_4_;
      auVar40._8_4_ = fVar333 * auVar134._8_4_;
      auVar40._12_4_ = fVar335 * auVar134._12_4_;
      auVar40._16_4_ = fVar337 * auVar134._16_4_;
      auVar40._20_4_ = fVar339 * auVar134._20_4_;
      uVar2 = auVar134._28_4_;
      auVar40._24_4_ = fVar341 * auVar134._24_4_;
      auVar40._28_4_ = uVar2;
      auVar14 = vsubps_avx(auVar97,auVar40);
      auVar41._4_4_ = fStack_47c * -fVar110;
      auVar41._0_4_ = local_480 * -fVar81;
      auVar41._8_4_ = fStack_478 * -fVar113;
      auVar41._12_4_ = fStack_474 * -fVar116;
      auVar41._16_4_ = fStack_470 * -fVar117;
      auVar41._20_4_ = fStack_46c * -fVar118;
      auVar41._24_4_ = fStack_468 * -fVar119;
      auVar41._28_4_ = local_880._28_4_ ^ 0x80000000;
      auVar42._4_4_ = fVar381 * fStack_49c;
      auVar42._0_4_ = fVar376 * local_4a0;
      auVar42._8_4_ = fVar382 * fStack_498;
      auVar42._12_4_ = fVar383 * fStack_494;
      auVar42._16_4_ = fVar384 * fStack_490;
      auVar42._20_4_ = fVar385 * fStack_48c;
      auVar42._24_4_ = fVar386 * fStack_488;
      auVar42._28_4_ = uVar2;
      auVar97 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar165 * fVar330;
      auVar43._0_4_ = fVar163 * fVar324;
      auVar43._8_4_ = fVar279 * fVar333;
      auVar43._12_4_ = fVar281 * fVar335;
      auVar43._16_4_ = fVar283 * fVar337;
      auVar43._20_4_ = fVar285 * fVar339;
      auVar43._24_4_ = fVar287 * fVar341;
      auVar43._28_4_ = uVar2;
      auVar359._8_4_ = 0x3f800000;
      auVar359._0_8_ = &DAT_3f8000003f800000;
      auVar359._12_4_ = 0x3f800000;
      auVar359._16_4_ = 0x3f800000;
      auVar359._20_4_ = 0x3f800000;
      auVar359._24_4_ = 0x3f800000;
      auVar359._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar97,auVar43);
      auVar97 = vrcpps_avx(auVar15);
      fVar223 = auVar97._0_4_;
      fVar252 = auVar97._4_4_;
      auVar44._4_4_ = auVar15._4_4_ * fVar252;
      auVar44._0_4_ = auVar15._0_4_ * fVar223;
      fVar199 = auVar97._8_4_;
      auVar44._8_4_ = auVar15._8_4_ * fVar199;
      fVar227 = auVar97._12_4_;
      auVar44._12_4_ = auVar15._12_4_ * fVar227;
      fVar256 = auVar97._16_4_;
      auVar44._16_4_ = auVar15._16_4_ * fVar256;
      fVar201 = auVar97._20_4_;
      auVar44._20_4_ = auVar15._20_4_ * fVar201;
      fVar205 = auVar97._24_4_;
      auVar44._24_4_ = auVar15._24_4_ * fVar205;
      auVar44._28_4_ = fStack_484;
      auVar16 = vsubps_avx(auVar359,auVar44);
      auVar97 = vandps_avx(auVar15,auVar290);
      auVar134 = vcmpps_avx(auVar97,auVar346,1);
      auVar45._4_4_ = (fVar252 + fVar252 * auVar16._4_4_) * -auVar14._4_4_;
      auVar45._0_4_ = (fVar223 + fVar223 * auVar16._0_4_) * -auVar14._0_4_;
      auVar45._8_4_ = (fVar199 + fVar199 * auVar16._8_4_) * -auVar14._8_4_;
      auVar45._12_4_ = (fVar227 + fVar227 * auVar16._12_4_) * -auVar14._12_4_;
      auVar45._16_4_ = (fVar256 + fVar256 * auVar16._16_4_) * -auVar14._16_4_;
      auVar45._20_4_ = (fVar201 + fVar201 * auVar16._20_4_) * -auVar14._20_4_;
      auVar45._24_4_ = (fVar205 + fVar205 * auVar16._24_4_) * -auVar14._24_4_;
      auVar45._28_4_ = auVar14._28_4_ ^ 0x80000000;
      auVar97 = vcmpps_avx(auVar15,auVar100,1);
      auVar97 = vorps_avx(auVar134,auVar97);
      auVar97 = vblendvps_avx(auVar45,auVar299,auVar97);
      _local_620 = vmaxps_avx(auVar361,auVar97);
      auVar276 = ZEXT3264(_local_620);
      auVar97 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,6);
      auVar97 = vorps_avx(auVar134,auVar97);
      auVar250 = ZEXT3264(local_340);
      auVar134 = vblendvps_avx(auVar45,auVar321,auVar97);
      auVar97 = vandps_avx(local_340,auVar98);
      local_3c0 = vminps_avx(auVar379,auVar134);
      auVar98 = vcmpps_avx(_local_620,local_3c0,2);
      auVar134 = auVar97 & auVar98;
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0x7f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0xbf,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar134[0x1f]) {
        auVar293 = ZEXT3264(local_800);
        auVar328 = ZEXT3264(local_900);
        auVar322 = ZEXT3264(local_a20);
      }
      else {
        auVar134 = vminps_avx(_local_8a0,local_6c0);
        auVar12 = vminps_avx(auVar12,local_7e0);
        auVar134 = vminps_avx(auVar134,auVar12);
        auVar134 = vsubps_avx(auVar134,auVar13);
        auVar97 = vandps_avx(auVar98,auVar97);
        auVar71._4_4_ = local_420[1];
        auVar71._0_4_ = local_420[0];
        auVar71._8_4_ = local_420[2];
        auVar71._12_4_ = local_420[3];
        auVar71._16_4_ = fStack_410;
        auVar71._20_4_ = fStack_40c;
        auVar71._24_4_ = fStack_408;
        auVar71._28_4_ = fStack_404;
        auVar98 = vminps_avx(auVar71,auVar359);
        auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
        local_420[0] = fVar79 + fVar120 * (auVar98._0_4_ + 0.0) * 0.125;
        local_420[1] = fVar108 + fVar152 * (auVar98._4_4_ + 1.0) * 0.125;
        local_420[2] = fVar111 + fVar154 * (auVar98._8_4_ + 2.0) * 0.125;
        local_420[3] = fVar114 + fVar157 * (auVar98._12_4_ + 3.0) * 0.125;
        fStack_410 = fVar79 + fVar120 * (auVar98._16_4_ + 4.0) * 0.125;
        fStack_40c = fVar108 + fVar152 * (auVar98._20_4_ + 5.0) * 0.125;
        fStack_408 = fVar111 + fVar154 * (auVar98._24_4_ + 6.0) * 0.125;
        fStack_404 = fVar114 + auVar98._28_4_ + 7.0;
        auVar70._4_4_ = local_440[1];
        auVar70._0_4_ = local_440[0];
        auVar70._8_4_ = local_440[2];
        auVar70._12_4_ = local_440[3];
        auVar70._16_4_ = fStack_430;
        auVar70._20_4_ = fStack_42c;
        auVar70._24_4_ = fStack_428;
        auVar70._28_4_ = fStack_424;
        auVar98 = vminps_avx(auVar70,auVar359);
        auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
        local_440[0] = fVar79 + fVar120 * (auVar98._0_4_ + 0.0) * 0.125;
        local_440[1] = fVar108 + fVar152 * (auVar98._4_4_ + 1.0) * 0.125;
        local_440[2] = fVar111 + fVar154 * (auVar98._8_4_ + 2.0) * 0.125;
        local_440[3] = fVar114 + fVar157 * (auVar98._12_4_ + 3.0) * 0.125;
        fStack_430 = fVar79 + fVar120 * (auVar98._16_4_ + 4.0) * 0.125;
        fStack_42c = fVar108 + fVar152 * (auVar98._20_4_ + 5.0) * 0.125;
        fStack_428 = fVar111 + fVar154 * (auVar98._24_4_ + 6.0) * 0.125;
        fStack_424 = fVar114 + auVar98._28_4_ + 7.0;
        auVar46._4_4_ = auVar134._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar134._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar134._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar134._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar134._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar134._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar134._24_4_ * 0.99999976;
        auVar46._28_4_ = 0x3f7ffffc;
        auVar98 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
        auVar47._4_4_ = auVar98._4_4_ * auVar98._4_4_;
        auVar47._0_4_ = auVar98._0_4_ * auVar98._0_4_;
        auVar47._8_4_ = auVar98._8_4_ * auVar98._8_4_;
        auVar47._12_4_ = auVar98._12_4_ * auVar98._12_4_;
        auVar47._16_4_ = auVar98._16_4_ * auVar98._16_4_;
        auVar47._20_4_ = auVar98._20_4_ * auVar98._20_4_;
        auVar47._24_4_ = auVar98._24_4_ * auVar98._24_4_;
        auVar47._28_4_ = auVar98._28_4_;
        _local_840 = vsubps_avx(local_6e0,auVar47);
        auVar48._4_4_ = local_840._4_4_ * fStack_71c;
        auVar48._0_4_ = local_840._0_4_ * local_720;
        auVar48._8_4_ = local_840._8_4_ * fStack_718;
        auVar48._12_4_ = local_840._12_4_ * fStack_714;
        auVar48._16_4_ = local_840._16_4_ * fStack_710;
        auVar48._20_4_ = local_840._20_4_ * fStack_70c;
        auVar48._24_4_ = local_840._24_4_ * fStack_708;
        auVar48._28_4_ = auVar98._28_4_;
        auVar134 = vsubps_avx(local_700,auVar48);
        local_820 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,5);
        fVar223 = local_620._28_4_;
        auVar98 = local_820;
        if ((((((((local_820 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_820 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_820 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_820 >> 0x7f,0) == '\0') &&
              (local_820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_820 >> 0xbf,0) == '\0') &&
            (local_820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_820[0x1f]) {
          _local_600 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar379 = ZEXT832(0);
          _local_ac0 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar137._8_4_ = 0x7f800000;
          auVar137._0_8_ = 0x7f8000007f800000;
          auVar137._12_4_ = 0x7f800000;
          auVar137._16_4_ = 0x7f800000;
          auVar137._20_4_ = 0x7f800000;
          auVar137._24_4_ = 0x7f800000;
          auVar137._28_4_ = 0x7f800000;
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          _local_a80 = _local_ac0;
          _local_960 = _local_ac0;
          _local_840 = auVar20;
          local_820 = auVar19;
          _local_760 = _local_ac0;
          _local_5e0 = _local_600;
        }
        else {
          auVar379 = vsqrtps_avx(auVar134);
          auVar138._0_4_ = fVar264 + fVar264;
          auVar138._4_4_ = fVar354 + fVar354;
          auVar138._8_4_ = fVar158 + fVar158;
          auVar138._12_4_ = fVar160 + fVar160;
          auVar138._16_4_ = fVar162 + fVar162;
          auVar138._20_4_ = fVar164 + fVar164;
          auVar138._24_4_ = fVar318 + fVar318;
          auVar138._28_4_ = fVar183 + fVar183;
          auVar12 = vrcpps_avx(auVar138);
          fVar183 = auVar12._0_4_;
          fVar252 = auVar12._4_4_;
          auVar49._4_4_ = auVar138._4_4_ * fVar252;
          auVar49._0_4_ = auVar138._0_4_ * fVar183;
          fVar199 = auVar12._8_4_;
          auVar49._8_4_ = auVar138._8_4_ * fVar199;
          fVar227 = auVar12._12_4_;
          auVar49._12_4_ = auVar138._12_4_ * fVar227;
          fVar256 = auVar12._16_4_;
          auVar49._16_4_ = auVar138._16_4_ * fVar256;
          fVar201 = auVar12._20_4_;
          auVar49._20_4_ = auVar138._20_4_ * fVar201;
          fVar205 = auVar12._24_4_;
          auVar49._24_4_ = auVar138._24_4_ * fVar205;
          auVar49._28_4_ = auVar138._28_4_;
          auVar361 = vsubps_avx(auVar359,auVar49);
          fVar183 = fVar183 + fVar183 * auVar361._0_4_;
          fVar252 = fVar252 + fVar252 * auVar361._4_4_;
          fVar199 = fVar199 + fVar199 * auVar361._8_4_;
          fVar227 = fVar227 + fVar227 * auVar361._12_4_;
          fVar256 = fVar256 + fVar256 * auVar361._16_4_;
          fVar201 = fVar201 + fVar201 * auVar361._20_4_;
          fVar205 = fVar205 + fVar205 * auVar361._24_4_;
          fVar260 = auVar12._28_4_ + auVar361._28_4_;
          auVar139._0_8_ = auVar327._0_8_ ^ 0x8000000080000000;
          auVar139._8_4_ = -auVar327._8_4_;
          auVar139._12_4_ = -auVar327._12_4_;
          auVar139._16_4_ = -auVar327._16_4_;
          auVar139._20_4_ = -auVar327._20_4_;
          auVar139._24_4_ = -auVar327._24_4_;
          auVar139._28_4_ = -auVar327._28_4_;
          auVar12 = vsubps_avx(auVar139,auVar379);
          fVar207 = auVar12._0_4_ * fVar183;
          fVar224 = auVar12._4_4_ * fVar252;
          auVar50._4_4_ = fVar224;
          auVar50._0_4_ = fVar207;
          fVar231 = auVar12._8_4_ * fVar199;
          auVar50._8_4_ = fVar231;
          fVar232 = auVar12._12_4_ * fVar227;
          auVar50._12_4_ = fVar232;
          fVar230 = auVar12._16_4_ * fVar256;
          auVar50._16_4_ = fVar230;
          fVar257 = auVar12._20_4_ * fVar201;
          auVar50._20_4_ = fVar257;
          fVar259 = auVar12._24_4_ * fVar205;
          auVar50._24_4_ = fVar259;
          auVar50._28_4_ = auVar12._28_4_;
          auVar12 = vsubps_avx(auVar379,auVar327);
          fVar183 = auVar12._0_4_ * fVar183;
          fVar252 = auVar12._4_4_ * fVar252;
          auVar51._4_4_ = fVar252;
          auVar51._0_4_ = fVar183;
          fVar199 = auVar12._8_4_ * fVar199;
          auVar51._8_4_ = fVar199;
          fVar227 = auVar12._12_4_ * fVar227;
          auVar51._12_4_ = fVar227;
          fVar256 = auVar12._16_4_ * fVar256;
          auVar51._16_4_ = fVar256;
          fVar201 = auVar12._20_4_ * fVar201;
          auVar51._20_4_ = fVar201;
          fVar205 = auVar12._24_4_ * fVar205;
          auVar51._24_4_ = fVar205;
          auVar51._28_4_ = 0x3f800000;
          fVar277 = fVar294 * (fVar207 * fVar307 + fVar356);
          fVar278 = fVar301 * (fVar224 * fVar312 + fVar363);
          fVar280 = fVar302 * (fVar231 * fVar313 + fVar365);
          fVar258 = fVar303 * (fVar232 * fVar314 + fVar367);
          fVar353 = fVar304 * (fVar230 * fVar315 + fVar369);
          fVar261 = fVar305 * (fVar257 * fVar316 + fVar371);
          fVar264 = fVar306 * (fVar259 * fVar317 + fVar373);
          auVar196._0_4_ = fVar80 + fVar198 * fVar277;
          auVar196._4_4_ = fVar109 + fVar200 * fVar278;
          auVar196._8_4_ = fVar112 + fVar204 * fVar280;
          auVar196._12_4_ = fVar115 + fVar229 * fVar258;
          auVar196._16_4_ = fStack_a90 + fVar255 * fVar353;
          auVar196._20_4_ = fStack_a8c + fVar265 * fVar261;
          auVar196._24_4_ = fStack_a88 + fVar286 * fVar264;
          auVar196._28_4_ = fStack_a84 + auVar12._28_4_ + fVar375;
          auVar52._4_4_ = fVar165 * fVar224;
          auVar52._0_4_ = fVar163 * fVar207;
          auVar52._8_4_ = fVar279 * fVar231;
          auVar52._12_4_ = fVar281 * fVar232;
          auVar52._16_4_ = fVar283 * fVar230;
          auVar52._20_4_ = fVar285 * fVar257;
          auVar52._24_4_ = fVar287 * fVar259;
          auVar52._28_4_ = fVar260;
          _local_a80 = vsubps_avx(auVar52,auVar196);
          auVar221._0_4_ = auVar387._0_4_ + fVar206 * fVar277;
          auVar221._4_4_ = auVar387._4_4_ + fVar225 * fVar278;
          auVar221._8_4_ = auVar387._8_4_ + fVar202 * fVar280;
          auVar221._12_4_ = auVar387._12_4_ + fVar226 * fVar258;
          auVar221._16_4_ = auVar387._16_4_ + fVar234 * fVar353;
          auVar221._20_4_ = auVar387._20_4_ + fVar262 * fVar261;
          auVar221._24_4_ = auVar387._24_4_ + fVar282 * fVar264;
          auVar221._28_4_ = auVar387._28_4_ + fVar260;
          auVar53._4_4_ = fStack_49c * fVar224;
          auVar53._0_4_ = local_4a0 * fVar207;
          auVar53._8_4_ = fStack_498 * fVar231;
          auVar53._12_4_ = fStack_494 * fVar232;
          auVar53._16_4_ = fStack_490 * fVar230;
          auVar53._20_4_ = fStack_48c * fVar257;
          auVar53._24_4_ = fStack_488 * fVar259;
          auVar53._28_4_ = fVar223;
          _local_ac0 = vsubps_avx(auVar53,auVar221);
          auVar244._0_4_ = auVar310._0_4_ + fVar233 * fVar277;
          auVar244._4_4_ = auVar310._4_4_ + fVar254 * fVar278;
          auVar244._8_4_ = auVar310._8_4_ + fVar203 * fVar280;
          auVar244._12_4_ = auVar310._12_4_ + fVar228 * fVar258;
          auVar244._16_4_ = auVar310._16_4_ + fVar253 * fVar353;
          auVar244._20_4_ = auVar310._20_4_ + fVar263 * fVar261;
          auVar244._24_4_ = auVar310._24_4_ + fVar284 * fVar264;
          auVar244._28_4_ = auVar310._28_4_ + 0.0;
          auVar54._4_4_ = fStack_47c * fVar224;
          auVar54._0_4_ = local_480 * fVar207;
          auVar54._8_4_ = fStack_478 * fVar231;
          auVar54._12_4_ = fStack_474 * fVar232;
          auVar54._16_4_ = fStack_470 * fVar230;
          auVar54._20_4_ = fStack_46c * fVar257;
          auVar54._24_4_ = fStack_468 * fVar259;
          auVar54._28_4_ = fVar223;
          _local_960 = vsubps_avx(auVar54,auVar244);
          fVar294 = fVar294 * (fVar183 * fVar307 + fVar356);
          fVar301 = fVar301 * (fVar252 * fVar312 + fVar363);
          fVar302 = fVar302 * (fVar199 * fVar313 + fVar365);
          fVar303 = fVar303 * (fVar227 * fVar314 + fVar367);
          fVar304 = fVar304 * (fVar256 * fVar315 + fVar369);
          fVar305 = fVar305 * (fVar201 * fVar316 + fVar371);
          fVar306 = fVar306 * (fVar205 * fVar317 + fVar373);
          auVar273._0_4_ = fVar80 + fVar198 * fVar294;
          auVar273._4_4_ = fVar109 + fVar200 * fVar301;
          auVar273._8_4_ = fVar112 + fVar204 * fVar302;
          auVar273._12_4_ = fVar115 + fVar229 * fVar303;
          auVar273._16_4_ = fStack_a90 + fVar255 * fVar304;
          auVar273._20_4_ = fStack_a8c + fVar265 * fVar305;
          auVar273._24_4_ = fStack_a88 + fVar286 * fVar306;
          auVar273._28_4_ = fStack_a84 + fVar223;
          auVar55._4_4_ = fVar165 * fVar252;
          auVar55._0_4_ = fVar163 * fVar183;
          auVar55._8_4_ = fVar279 * fVar199;
          auVar55._12_4_ = fVar281 * fVar227;
          auVar55._16_4_ = fVar283 * fVar256;
          auVar55._20_4_ = fVar285 * fVar201;
          auVar55._24_4_ = fVar287 * fVar205;
          auVar55._28_4_ = fStack_a84;
          _local_600 = vsubps_avx(auVar55,auVar273);
          auVar274._0_4_ = auVar387._0_4_ + fVar206 * fVar294;
          auVar274._4_4_ = auVar387._4_4_ + fVar225 * fVar301;
          auVar274._8_4_ = auVar387._8_4_ + fVar202 * fVar302;
          auVar274._12_4_ = auVar387._12_4_ + fVar226 * fVar303;
          auVar274._16_4_ = auVar387._16_4_ + fVar234 * fVar304;
          auVar274._20_4_ = auVar387._20_4_ + fVar262 * fVar305;
          auVar274._24_4_ = auVar387._24_4_ + fVar282 * fVar306;
          auVar274._28_4_ = auVar387._28_4_ + local_600._28_4_;
          auVar56._4_4_ = fStack_49c * fVar252;
          auVar56._0_4_ = local_4a0 * fVar183;
          auVar56._8_4_ = fStack_498 * fVar199;
          auVar56._12_4_ = fStack_494 * fVar227;
          auVar56._16_4_ = fStack_490 * fVar256;
          auVar56._20_4_ = fStack_48c * fVar201;
          auVar56._24_4_ = fStack_488 * fVar205;
          auVar56._28_4_ = fStack_a84;
          _local_5e0 = vsubps_avx(auVar56,auVar274);
          auVar245._0_4_ = auVar310._0_4_ + fVar233 * fVar294;
          auVar245._4_4_ = auVar310._4_4_ + fVar254 * fVar301;
          auVar245._8_4_ = auVar310._8_4_ + fVar203 * fVar302;
          auVar245._12_4_ = auVar310._12_4_ + fVar228 * fVar303;
          auVar245._16_4_ = auVar310._16_4_ + fVar253 * fVar304;
          auVar245._20_4_ = auVar310._20_4_ + fVar263 * fVar305;
          auVar245._24_4_ = auVar310._24_4_ + fVar284 * fVar306;
          auVar245._28_4_ = auVar310._28_4_ + local_960._28_4_ + fVar375;
          auVar57._4_4_ = fVar252 * fStack_47c;
          auVar57._0_4_ = fVar183 * local_480;
          auVar57._8_4_ = fVar199 * fStack_478;
          auVar57._12_4_ = fVar227 * fStack_474;
          auVar57._16_4_ = fVar256 * fStack_470;
          auVar57._20_4_ = fVar201 * fStack_46c;
          auVar57._24_4_ = fVar205 * fStack_468;
          auVar57._28_4_ = local_5e0._28_4_;
          _local_760 = vsubps_avx(auVar57,auVar245);
          auVar379 = ZEXT1632(ZEXT816(0));
          auVar12 = vcmpps_avx(auVar134,_DAT_02020f00,5);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar137 = vblendvps_avx(auVar246,auVar50,auVar12);
          auVar291._8_4_ = 0x7fffffff;
          auVar291._0_8_ = 0x7fffffff7fffffff;
          auVar291._12_4_ = 0x7fffffff;
          auVar291._16_4_ = 0x7fffffff;
          auVar291._20_4_ = 0x7fffffff;
          auVar291._24_4_ = 0x7fffffff;
          auVar291._28_4_ = 0x7fffffff;
          auVar134 = vandps_avx(auVar291,auVar30);
          auVar134 = vmaxps_avx(local_360,auVar134);
          auVar58._4_4_ = auVar134._4_4_ * 1.9073486e-06;
          auVar58._0_4_ = auVar134._0_4_ * 1.9073486e-06;
          auVar58._8_4_ = auVar134._8_4_ * 1.9073486e-06;
          auVar58._12_4_ = auVar134._12_4_ * 1.9073486e-06;
          auVar58._16_4_ = auVar134._16_4_ * 1.9073486e-06;
          auVar58._20_4_ = auVar134._20_4_ * 1.9073486e-06;
          auVar58._24_4_ = auVar134._24_4_ * 1.9073486e-06;
          auVar58._28_4_ = auVar134._28_4_;
          auVar134 = vandps_avx(auVar291,auVar176);
          auVar134 = vcmpps_avx(auVar134,auVar58,1);
          auVar247._8_4_ = 0xff800000;
          auVar247._0_8_ = 0xff800000ff800000;
          auVar247._12_4_ = 0xff800000;
          auVar247._16_4_ = 0xff800000;
          auVar247._20_4_ = 0xff800000;
          auVar247._24_4_ = 0xff800000;
          auVar247._28_4_ = 0xff800000;
          auVar243 = vblendvps_avx(auVar247,auVar51,auVar12);
          auVar176 = auVar12 & auVar134;
          _local_980 = auVar97;
          if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar176 >> 0x7f,0) != '\0') ||
                (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0xbf,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar176[0x1f] < '\0') {
            auVar98 = vandps_avx(auVar134,auVar12);
            auVar133 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar361 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar176 = vcmpps_avx(_local_840,auVar361,2);
            auVar380._8_4_ = 0xff800000;
            auVar380._0_8_ = 0xff800000ff800000;
            auVar380._12_4_ = 0xff800000;
            auVar380._16_4_ = 0xff800000;
            auVar380._20_4_ = 0xff800000;
            auVar380._24_4_ = 0xff800000;
            auVar380._28_4_ = 0xff800000;
            auVar388._8_4_ = 0x7f800000;
            auVar388._0_8_ = 0x7f8000007f800000;
            auVar388._12_4_ = 0x7f800000;
            auVar388._16_4_ = 0x7f800000;
            auVar388._20_4_ = 0x7f800000;
            auVar388._24_4_ = 0x7f800000;
            auVar388._28_4_ = 0x7f800000;
            auVar134 = vblendvps_avx(auVar388,auVar380,auVar176);
            auVar92 = vpmovsxwd_avx(auVar133);
            auVar133 = vpunpckhwd_avx(auVar133,auVar133);
            auVar292._16_16_ = auVar133;
            auVar292._0_16_ = auVar92;
            auVar137 = vblendvps_avx(auVar137,auVar134,auVar292);
            auVar134 = vblendvps_avx(auVar380,auVar388,auVar176);
            auVar243 = vblendvps_avx(auVar243,auVar134,auVar292);
            auVar379 = ZEXT832(0) << 0x20;
            auVar134 = vcmpps_avx(auVar361,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar182._0_4_ = auVar98._0_4_ ^ auVar134._0_4_;
            auVar182._4_4_ = auVar98._4_4_ ^ auVar134._4_4_;
            auVar182._8_4_ = auVar98._8_4_ ^ auVar134._8_4_;
            auVar182._12_4_ = auVar98._12_4_ ^ auVar134._12_4_;
            auVar182._16_4_ = auVar98._16_4_ ^ auVar134._16_4_;
            auVar182._20_4_ = auVar98._20_4_ ^ auVar134._20_4_;
            auVar182._24_4_ = auVar98._24_4_ ^ auVar134._24_4_;
            auVar182._28_4_ = auVar98._28_4_ ^ auVar134._28_4_;
            auVar98 = vorps_avx(auVar176,auVar182);
            auVar98 = vandps_avx(auVar12,auVar98);
          }
        }
        auVar293 = ZEXT3264(local_800);
        auVar276 = ZEXT3264(_local_620);
        fVar183 = (ray->dir).field_0.m128[0];
        fVar206 = (ray->dir).field_0.m128[1];
        local_640 = (ray->dir).field_0.m128[2];
        local_3a0 = _local_620;
        local_380 = vminps_avx(local_3c0,auVar137);
        _local_500 = vmaxps_avx(_local_620,auVar243);
        _local_3e0 = _local_500;
        auVar134 = vcmpps_avx(_local_620,local_380,2);
        local_4c0 = vandps_avx(auVar97,auVar134);
        auVar134 = vcmpps_avx(_local_500,local_3c0,2);
        local_580 = vandps_avx(auVar97,auVar134);
        auVar250 = ZEXT3264(local_580);
        auVar97 = vorps_avx(local_580,local_4c0);
        auVar328 = ZEXT3264(local_900);
        auVar322 = ZEXT3264(local_a20);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          auVar97 = vcmpps_avx(auVar379,auVar379,0xf);
          local_540._0_4_ = auVar98._0_4_ ^ auVar97._0_4_;
          local_540._4_4_ = auVar98._4_4_ ^ auVar97._4_4_;
          local_540._8_4_ = auVar98._8_4_ ^ auVar97._8_4_;
          local_540._12_4_ = auVar98._12_4_ ^ auVar97._12_4_;
          local_540._16_4_ = auVar98._16_4_ ^ auVar97._16_4_;
          local_540._20_4_ = auVar98._20_4_ ^ auVar97._20_4_;
          local_540._24_4_ = auVar98._24_4_ ^ auVar97._24_4_;
          local_540._28_4_ = (uint)auVar98._28_4_ ^ (uint)auVar97._28_4_;
          auVar103._0_4_ =
               fVar183 * (float)local_a80._0_4_ +
               fVar206 * (float)local_ac0._0_4_ + local_640 * (float)local_960._0_4_;
          auVar103._4_4_ =
               fVar183 * (float)local_a80._4_4_ +
               fVar206 * (float)local_ac0._4_4_ + local_640 * (float)local_960._4_4_;
          auVar103._8_4_ = fVar183 * fStack_a78 + fVar206 * fStack_ab8 + local_640 * fStack_958;
          auVar103._12_4_ = fVar183 * fStack_a74 + fVar206 * fStack_ab4 + local_640 * fStack_954;
          auVar103._16_4_ = fVar183 * fStack_a70 + fVar206 * fStack_ab0 + local_640 * fStack_950;
          auVar103._20_4_ = fVar183 * fStack_a6c + fVar206 * fStack_aac + local_640 * fStack_94c;
          auVar103._24_4_ = fVar183 * fStack_a68 + fVar206 * fStack_aa8 + local_640 * fStack_948;
          auVar103._28_4_ = auVar97._28_4_ + local_500._28_4_ + auVar98._28_4_;
          auVar140._8_4_ = 0x7fffffff;
          auVar140._0_8_ = 0x7fffffff7fffffff;
          auVar140._12_4_ = 0x7fffffff;
          auVar140._16_4_ = 0x7fffffff;
          auVar140._20_4_ = 0x7fffffff;
          auVar140._24_4_ = 0x7fffffff;
          auVar140._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar103,auVar140);
          auVar141._8_4_ = 0x3e99999a;
          auVar141._0_8_ = 0x3e99999a3e99999a;
          auVar141._12_4_ = 0x3e99999a;
          auVar141._16_4_ = 0x3e99999a;
          auVar141._20_4_ = 0x3e99999a;
          auVar141._24_4_ = 0x3e99999a;
          auVar141._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar141,1);
          auVar97 = vorps_avx(auVar97,local_540);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar178,auVar142,auVar97);
          local_660 = ZEXT432((uint)uVar78);
          local_400 = vpshufd_avx(ZEXT416((uint)uVar78),0);
          auVar133 = vpcmpgtd_avx(auVar97._16_16_,local_400);
          auVar92 = vpcmpgtd_avx(auVar97._0_16_,local_400);
          auVar143._16_16_ = auVar133;
          auVar143._0_16_ = auVar92;
          auVar98 = vblendps_avx(ZEXT1632(auVar92),auVar143,0xf0);
          auVar97 = vandnps_avx(auVar98,local_4c0);
          auVar134 = local_4c0 & ~auVar98;
          auStack_5b8 = auVar13._8_24_;
          local_5c0 = uVar78;
          fStack_63c = local_640;
          fStack_638 = local_640;
          fStack_634 = local_640;
          fStack_630 = local_640;
          fStack_62c = local_640;
          fStack_628 = local_640;
          fStack_624 = local_640;
          local_520 = local_580;
          local_4e0 = auVar98;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0x7f,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0xbf,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar134[0x1f]) {
            auVar250 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            fVar198 = fVar206;
            fVar223 = fVar206;
            fVar252 = fVar206;
            fVar199 = fVar206;
            fVar225 = fVar206;
            fVar254 = fVar206;
            fVar200 = fVar183;
            fVar227 = fVar183;
            fVar256 = fVar183;
            fVar201 = fVar183;
            fVar202 = fVar183;
            fVar203 = fVar183;
            local_560 = auVar97;
          }
          else {
            local_740._4_4_ = (float)local_620._4_4_ + (float)local_7c0._4_4_;
            local_740._0_4_ = (float)local_620._0_4_ + (float)local_7c0._0_4_;
            fStack_738 = fStack_618 + fStack_7b8;
            fStack_734 = fStack_614 + fStack_7b4;
            fStack_730 = fStack_610 + fStack_7b0;
            fStack_72c = fStack_60c + fStack_7ac;
            fStack_728 = fStack_608 + fStack_7a8;
            fStack_724 = fVar223 + fStack_7a4;
            auVar250 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            local_8a0._4_4_ = fVar183;
            local_8a0._0_4_ = fVar183;
            fStack_898 = fVar183;
            fStack_894 = fVar183;
            fStack_890 = fVar183;
            fStack_88c = fVar183;
            fStack_888 = fVar183;
            fStack_884 = fVar183;
            local_940._4_4_ = fVar206;
            local_940._0_4_ = fVar206;
            fStack_938 = fVar206;
            fStack_934 = fVar206;
            fStack_930 = fVar206;
            fStack_92c = fVar206;
            fStack_928 = fVar206;
            fStack_924 = fVar206;
            do {
              auVar212 = auVar250._0_16_;
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar98 = vblendvps_avx(auVar144,_local_620,auVar97);
              auVar13 = vshufps_avx(auVar98,auVar98,0xb1);
              auVar13 = vminps_avx(auVar98,auVar13);
              auVar134 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar134);
              auVar134 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar134);
              auVar13 = vcmpps_avx(auVar98,auVar13,0);
              auVar134 = auVar97 & auVar13;
              auVar98 = auVar97;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar98 = vandps_avx(auVar13,auVar97);
              }
              uVar73 = vmovmskps_avx(auVar98);
              uVar72 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
                }
              }
              uVar78 = (ulong)uVar72;
              local_560 = auVar97;
              *(undefined4 *)(local_560 + uVar78 * 4) = 0;
              aVar6 = (ray->dir).field_0;
              _local_980 = (undefined1  [16])aVar6;
              auVar133 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
              _local_a80 = ZEXT416((uint)local_420[uVar78]);
              local_aa0 = *(float *)(local_3a0 + uVar78 * 4);
              uStack_a9c = 0;
              uStack_a98 = 0;
              uStack_a94 = 0;
              if (auVar133._0_4_ < 0.0) {
                fVar183 = sqrtf(auVar133._0_4_);
                auVar212._8_4_ = 0x7fffffff;
                auVar212._0_8_ = 0x7fffffff7fffffff;
                auVar212._12_4_ = 0x7fffffff;
              }
              else {
                auVar133 = vsqrtss_avx(auVar133,auVar133);
                fVar183 = auVar133._0_4_;
              }
              auVar92 = vminps_avx(_local_9c0,_local_9e0);
              auVar133 = vmaxps_avx(_local_9c0,_local_9e0);
              auVar191 = vminps_avx(_local_9d0,_local_9f0);
              auVar132 = vminps_avx(auVar92,auVar191);
              auVar92 = vmaxps_avx(_local_9d0,_local_9f0);
              auVar191 = vmaxps_avx(auVar133,auVar92);
              auVar133 = vandps_avx(auVar132,auVar212);
              auVar92 = vandps_avx(auVar191,auVar212);
              auVar133 = vmaxps_avx(auVar133,auVar92);
              auVar92 = vmovshdup_avx(auVar133);
              auVar92 = vmaxss_avx(auVar92,auVar133);
              auVar133 = vshufpd_avx(auVar133,auVar133,1);
              auVar133 = vmaxss_avx(auVar133,auVar92);
              local_820._0_4_ = auVar133._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar183 * 1.9073486e-06;
              auVar133 = vshufps_avx(auVar191,auVar191,0xff);
              local_720 = auVar133._0_4_;
              fStack_71c = auVar133._4_4_;
              fStack_718 = auVar133._8_4_;
              fStack_714 = auVar133._12_4_;
              lVar76 = 5;
              do {
                fVar223 = 1.0 - local_a80._0_4_;
                auVar133 = vshufps_avx(_local_a80,_local_a80,0);
                fVar183 = auVar133._0_4_;
                fVar206 = auVar133._4_4_;
                fVar233 = auVar133._8_4_;
                fVar198 = auVar133._12_4_;
                auVar133 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                fVar252 = auVar133._0_4_;
                fVar199 = auVar133._4_4_;
                fVar225 = auVar133._8_4_;
                fVar254 = auVar133._12_4_;
                fVar200 = (float)local_9d0._0_4_ * fVar183 + (float)local_9e0._0_4_ * fVar252;
                fVar227 = (float)local_9d0._4_4_ * fVar206 + (float)local_9e0._4_4_ * fVar199;
                fVar256 = fStack_9c8 * fVar233 + fStack_9d8 * fVar225;
                fVar201 = fStack_9c4 * fVar198 + fStack_9d4 * fVar254;
                local_920._0_4_ =
                     fVar252 * ((float)local_9e0._0_4_ * fVar183 + fVar252 * (float)local_9c0._0_4_)
                     + fVar183 * fVar200;
                local_920._4_4_ =
                     fVar199 * ((float)local_9e0._4_4_ * fVar206 + fVar199 * (float)local_9c0._4_4_)
                     + fVar206 * fVar227;
                local_920._8_4_ =
                     fVar225 * (fStack_9d8 * fVar233 + fVar225 * fStack_9b8) + fVar233 * fVar256;
                local_920._12_4_ =
                     fVar254 * (fStack_9d4 * fVar198 + fVar254 * fStack_9b4) + fVar198 * fVar201;
                auVar186._0_4_ =
                     fVar252 * fVar200 +
                     fVar183 * (fVar183 * (float)local_9f0._0_4_ + (float)local_9d0._0_4_ * fVar252)
                ;
                auVar186._4_4_ =
                     fVar199 * fVar227 +
                     fVar206 * (fVar206 * (float)local_9f0._4_4_ + (float)local_9d0._4_4_ * fVar199)
                ;
                auVar186._8_4_ =
                     fVar225 * fVar256 + fVar233 * (fVar233 * fStack_9e8 + fStack_9c8 * fVar225);
                auVar186._12_4_ =
                     fVar254 * fVar201 + fVar198 * (fVar198 * fStack_9e4 + fStack_9c4 * fVar254);
                auVar298._4_4_ = uStack_a9c;
                auVar298._0_4_ = local_aa0;
                auVar298._8_4_ = uStack_a98;
                auVar298._12_4_ = uStack_a94;
                auVar133 = vshufps_avx(auVar298,auVar298,0);
                auVar126._0_4_ = auVar133._0_4_ * (float)local_980._0_4_ + 0.0;
                auVar126._4_4_ = auVar133._4_4_ * (float)local_980._4_4_ + 0.0;
                auVar126._8_4_ = auVar133._8_4_ * fStack_978 + 0.0;
                auVar126._12_4_ = auVar133._12_4_ * fStack_974 + 0.0;
                auVar87._0_4_ = fVar252 * local_920._0_4_ + fVar183 * auVar186._0_4_;
                auVar87._4_4_ = fVar199 * local_920._4_4_ + fVar206 * auVar186._4_4_;
                auVar87._8_4_ = fVar225 * local_920._8_4_ + fVar233 * auVar186._8_4_;
                auVar87._12_4_ = fVar254 * local_920._12_4_ + fVar198 * auVar186._12_4_;
                local_680._0_16_ = auVar87;
                auVar133 = vsubps_avx(auVar126,auVar87);
                _local_840 = auVar133;
                auVar133 = vdpps_avx(auVar133,auVar133,0x7f);
                _local_960 = auVar133;
                if (auVar133._0_4_ < 0.0) {
                  _local_ac0 = ZEXT416((uint)fVar223);
                  local_a40._0_16_ = auVar186;
                  fVar183 = sqrtf(auVar133._0_4_);
                  auVar298._4_4_ = uStack_a9c;
                  auVar298._0_4_ = local_aa0;
                  auVar298._8_4_ = uStack_a98;
                  auVar298._12_4_ = uStack_a94;
                  auVar186 = local_a40._0_16_;
                  fVar223 = (float)local_ac0._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar183 = auVar133._0_4_;
                }
                auVar133 = vsubps_avx(auVar186,local_920._0_16_);
                local_920._0_4_ = auVar133._0_4_ * 3.0;
                local_920._4_4_ = auVar133._4_4_ * 3.0;
                local_920._8_4_ = auVar133._8_4_ * 3.0;
                local_920._12_4_ = auVar133._12_4_ * 3.0;
                fVar206 = local_a80._0_4_;
                auVar133 = vshufps_avx(ZEXT416((uint)(fVar206 * 6.0)),ZEXT416((uint)(fVar206 * 6.0))
                                       ,0);
                auVar92 = ZEXT416((uint)((fVar223 - (fVar206 + fVar206)) * 6.0));
                auVar191 = vshufps_avx(auVar92,auVar92,0);
                auVar92 = ZEXT416((uint)((fVar206 - (fVar223 + fVar223)) * 6.0));
                auVar132 = vshufps_avx(auVar92,auVar92,0);
                auVar10 = vshufps_avx(ZEXT416((uint)(fVar223 * 6.0)),ZEXT416((uint)(fVar223 * 6.0)),
                                      0);
                auVar92 = vdpps_avx(local_920._0_16_,local_920._0_16_,0x7f);
                auVar127._0_4_ =
                     auVar10._0_4_ * (float)local_9c0._0_4_ +
                     auVar132._0_4_ * (float)local_9e0._0_4_ +
                     auVar133._0_4_ * (float)local_9f0._0_4_ +
                     auVar191._0_4_ * (float)local_9d0._0_4_;
                auVar127._4_4_ =
                     auVar10._4_4_ * (float)local_9c0._4_4_ +
                     auVar132._4_4_ * (float)local_9e0._4_4_ +
                     auVar133._4_4_ * (float)local_9f0._4_4_ +
                     auVar191._4_4_ * (float)local_9d0._4_4_;
                auVar127._8_4_ =
                     auVar10._8_4_ * fStack_9b8 +
                     auVar132._8_4_ * fStack_9d8 +
                     auVar133._8_4_ * fStack_9e8 + auVar191._8_4_ * fStack_9c8;
                auVar127._12_4_ =
                     auVar10._12_4_ * fStack_9b4 +
                     auVar132._12_4_ * fStack_9d4 +
                     auVar133._12_4_ * fStack_9e4 + auVar191._12_4_ * fStack_9c4;
                auVar133 = vblendps_avx(auVar92,_DAT_01feba10,0xe);
                auVar191 = vrsqrtss_avx(auVar133,auVar133);
                fVar233 = auVar191._0_4_;
                fVar206 = auVar92._0_4_;
                auVar191 = vdpps_avx(local_920._0_16_,auVar127,0x7f);
                auVar132 = vshufps_avx(auVar92,auVar92,0);
                auVar128._0_4_ = auVar127._0_4_ * auVar132._0_4_;
                auVar128._4_4_ = auVar127._4_4_ * auVar132._4_4_;
                auVar128._8_4_ = auVar127._8_4_ * auVar132._8_4_;
                auVar128._12_4_ = auVar127._12_4_ * auVar132._12_4_;
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar213._0_4_ = local_920._0_4_ * auVar191._0_4_;
                auVar213._4_4_ = local_920._4_4_ * auVar191._4_4_;
                auVar213._8_4_ = local_920._8_4_ * auVar191._8_4_;
                auVar213._12_4_ = local_920._12_4_ * auVar191._12_4_;
                auVar132 = vsubps_avx(auVar128,auVar213);
                auVar191 = vrcpss_avx(auVar133,auVar133);
                auVar133 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar298._0_4_ * (float)local_6a0._0_4_)));
                local_ac0._0_4_ = auVar133._0_4_;
                auVar133 = ZEXT416((uint)(auVar191._0_4_ * (2.0 - fVar206 * auVar191._0_4_)));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                uVar78 = CONCAT44(local_920._4_4_,local_920._0_4_);
                auVar268._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar268._8_4_ = -local_920._8_4_;
                auVar268._12_4_ = -local_920._12_4_;
                auVar191 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar206 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar187._0_4_ = auVar191._0_4_ * auVar132._0_4_ * auVar133._0_4_;
                auVar187._4_4_ = auVar191._4_4_ * auVar132._4_4_ * auVar133._4_4_;
                auVar187._8_4_ = auVar191._8_4_ * auVar132._8_4_ * auVar133._8_4_;
                auVar187._12_4_ = auVar191._12_4_ * auVar132._12_4_ * auVar133._12_4_;
                local_880._0_4_ = local_920._0_4_ * auVar191._0_4_;
                local_880._4_4_ = local_920._4_4_ * auVar191._4_4_;
                local_880._8_4_ = local_920._8_4_ * auVar191._8_4_;
                local_880._12_4_ = local_920._12_4_ * auVar191._12_4_;
                if (fVar206 < 0.0) {
                  local_a40._0_4_ = fVar183;
                  local_860._0_16_ = auVar268;
                  local_7e0._0_16_ = auVar187;
                  fVar206 = sqrtf(fVar206);
                  auVar187 = local_7e0._0_16_;
                  auVar268 = local_860._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar92,auVar92);
                  fVar206 = auVar133._0_4_;
                  local_a40._0_4_ = fVar183;
                }
                auVar133 = vdpps_avx(_local_840,local_880._0_16_,0x7f);
                local_860._0_4_ =
                     ((float)local_820._0_4_ / fVar206) * ((float)local_a40._0_4_ + 1.0) +
                     (float)local_a40._0_4_ * (float)local_820._0_4_ + (float)local_ac0._0_4_;
                auVar92 = vdpps_avx(auVar268,local_880._0_16_,0x7f);
                auVar191 = vdpps_avx(_local_840,auVar187,0x7f);
                auVar132 = vdpps_avx(_local_980,local_880._0_16_,0x7f);
                auVar10 = vdpps_avx(_local_840,auVar268,0x7f);
                fVar183 = auVar92._0_4_ + auVar191._0_4_;
                fVar206 = auVar133._0_4_;
                auVar88._0_4_ = fVar206 * fVar206;
                auVar88._4_4_ = auVar133._4_4_ * auVar133._4_4_;
                auVar88._8_4_ = auVar133._8_4_ * auVar133._8_4_;
                auVar88._12_4_ = auVar133._12_4_ * auVar133._12_4_;
                auVar191 = vsubps_avx(_local_960,auVar88);
                local_880._0_16_ = ZEXT416((uint)fVar183);
                auVar92 = vdpps_avx(_local_840,_local_980,0x7f);
                fVar233 = auVar10._0_4_ - fVar206 * fVar183;
                local_a40._0_16_ = auVar133;
                fVar206 = auVar92._0_4_ - auVar132._0_4_ * fVar206;
                auVar133 = vrsqrtss_avx(auVar191,auVar191);
                fVar198 = auVar191._0_4_;
                fVar183 = auVar133._0_4_;
                fVar183 = fVar183 * 1.5 + fVar198 * -0.5 * fVar183 * fVar183 * fVar183;
                if (fVar198 < 0.0) {
                  local_7e0._0_16_ = auVar132;
                  local_6c0._0_4_ = fVar233;
                  local_6e0._0_4_ = fVar206;
                  local_700._0_4_ = fVar183;
                  fVar198 = sqrtf(fVar198);
                  fVar183 = (float)local_700._0_4_;
                  fVar233 = (float)local_6c0._0_4_;
                  fVar206 = (float)local_6e0._0_4_;
                  auVar132 = local_7e0._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar191,auVar191);
                  fVar198 = auVar133._0_4_;
                }
                auVar191 = vpermilps_avx(local_680._0_16_,0xff);
                auVar10 = vpermilps_avx(local_920._0_16_,0xff);
                fVar233 = fVar233 * fVar183 - auVar10._0_4_;
                auVar214._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
                auVar214._8_4_ = auVar132._8_4_ ^ 0x80000000;
                auVar214._12_4_ = auVar132._12_4_ ^ 0x80000000;
                auVar238._0_4_ = -fVar233;
                auVar238._4_4_ = 0x80000000;
                auVar238._8_4_ = 0x80000000;
                auVar238._12_4_ = 0x80000000;
                auVar133 = vinsertps_avx(ZEXT416((uint)(fVar206 * fVar183)),auVar214,0x10);
                auVar92 = vmovsldup_avx(ZEXT416((uint)(local_880._0_4_ * fVar206 * fVar183 -
                                                      auVar132._0_4_ * fVar233)));
                auVar133 = vdivps_avx(auVar133,auVar92);
                auVar276 = ZEXT1664(local_a40._0_16_);
                auVar132 = ZEXT416((uint)(fVar198 - auVar191._0_4_));
                auVar191 = vinsertps_avx(local_a40._0_16_,auVar132,0x10);
                auVar188._0_4_ = auVar191._0_4_ * auVar133._0_4_;
                auVar188._4_4_ = auVar191._4_4_ * auVar133._4_4_;
                auVar188._8_4_ = auVar191._8_4_ * auVar133._8_4_;
                auVar188._12_4_ = auVar191._12_4_ * auVar133._12_4_;
                auVar133 = vinsertps_avx(auVar238,local_880._0_16_,0x1c);
                auVar133 = vdivps_avx(auVar133,auVar92);
                auVar92 = vhaddps_avx(auVar188,auVar188);
                auVar168._0_4_ = auVar191._0_4_ * auVar133._0_4_;
                auVar168._4_4_ = auVar191._4_4_ * auVar133._4_4_;
                auVar168._8_4_ = auVar191._8_4_ * auVar133._8_4_;
                auVar168._12_4_ = auVar191._12_4_ * auVar133._12_4_;
                auVar133 = vhaddps_avx(auVar168,auVar168);
                fVar233 = (float)local_a80._0_4_ - auVar92._0_4_;
                _local_a80 = ZEXT416((uint)fVar233);
                local_aa0 = local_aa0 - auVar133._0_4_;
                auVar215._8_4_ = 0x7fffffff;
                auVar215._0_8_ = 0x7fffffff7fffffff;
                auVar215._12_4_ = 0x7fffffff;
                auVar250 = ZEXT1664(auVar215);
                auVar133 = vandps_avx(local_a40._0_16_,auVar215);
                bVar59 = true;
                fVar198 = (float)local_940._4_4_;
                fVar223 = fStack_938;
                fVar252 = fStack_934;
                fVar199 = fStack_930;
                fVar225 = fStack_92c;
                fVar254 = fStack_928;
                fVar206 = (float)local_940._0_4_;
                fVar200 = (float)local_8a0._4_4_;
                fVar227 = fStack_898;
                fVar256 = fStack_894;
                fVar201 = fStack_890;
                fVar202 = fStack_88c;
                fVar203 = fStack_888;
                fVar183 = (float)local_8a0._0_4_;
                if ((float)local_860._0_4_ <= auVar133._0_4_) {
LAB_00f1bbc1:
                  uStack_a94 = 0;
                  uStack_a98 = 0;
                  uStack_a9c = 0;
                  auVar328 = ZEXT3264(local_900);
                  auVar322 = ZEXT3264(local_a20);
                }
                else {
                  auVar133 = vandps_avx(auVar132,auVar215);
                  if (local_720 * 1.9073486e-06 + (float)local_860._0_4_ + (float)local_ac0._0_4_ <=
                      auVar133._0_4_) goto LAB_00f1bbc1;
                  local_aa0 = local_aa0 + (float)local_790._0_4_;
                  bVar59 = false;
                  uStack_a9c = 0;
                  uStack_a98 = 0;
                  uStack_a94 = 0;
                  if (local_aa0 < (ray->org).field_0.m128[3]) {
                    unaff_R14B = 0;
                    goto LAB_00f1bbc1;
                  }
                  auVar328 = ZEXT3264(local_900);
                  if (ray->tfar < local_aa0) {
                    unaff_R14B = 0;
                    goto LAB_00f1bbc1;
                  }
                  auVar322 = ZEXT3264(local_a20);
                  if ((fVar233 < 0.0) || (1.0 < fVar233)) {
LAB_00f1bbe8:
                    bVar59 = false;
                    unaff_R14B = 0;
                  }
                  else {
                    local_ac0._0_4_ = ray->tfar;
                    auVar133 = vrsqrtss_avx(_local_960,_local_960);
                    fVar204 = auVar133._0_4_;
                    pGVar8 = (context->scene->geometries).items[local_a48].ptr;
                    if ((pGVar8->mask & ray->mask) == 0) goto LAB_00f1bbe8;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      auVar133 = ZEXT416((uint)(fVar204 * 1.5 +
                                               local_960._0_4_ * -0.5 * fVar204 * fVar204 * fVar204)
                                        );
                      auVar133 = vshufps_avx(auVar133,auVar133,0);
                      auVar169._0_4_ = auVar133._0_4_ * (float)local_840._0_4_;
                      auVar169._4_4_ = auVar133._4_4_ * (float)local_840._4_4_;
                      auVar169._8_4_ = auVar133._8_4_ * fStack_838;
                      auVar169._12_4_ = auVar133._12_4_ * fStack_834;
                      auVar89._0_4_ = local_920._0_4_ + auVar10._0_4_ * auVar169._0_4_;
                      auVar89._4_4_ = local_920._4_4_ + auVar10._4_4_ * auVar169._4_4_;
                      auVar89._8_4_ = local_920._8_4_ + auVar10._8_4_ * auVar169._8_4_;
                      auVar89._12_4_ = local_920._12_4_ + auVar10._12_4_ * auVar169._12_4_;
                      auVar133 = vshufps_avx(auVar169,auVar169,0xc9);
                      auVar92 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                      auVar189._0_4_ = auVar92._0_4_ * auVar169._0_4_;
                      auVar189._4_4_ = auVar92._4_4_ * auVar169._4_4_;
                      auVar189._8_4_ = auVar92._8_4_ * auVar169._8_4_;
                      auVar189._12_4_ = auVar92._12_4_ * auVar169._12_4_;
                      auVar170._0_4_ = auVar133._0_4_ * local_920._0_4_;
                      auVar170._4_4_ = auVar133._4_4_ * local_920._4_4_;
                      auVar170._8_4_ = auVar133._8_4_ * local_920._8_4_;
                      auVar170._12_4_ = auVar133._12_4_ * local_920._12_4_;
                      auVar191 = vsubps_avx(auVar170,auVar189);
                      auVar133 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar92 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar171._0_4_ = auVar92._0_4_ * auVar133._0_4_;
                      auVar171._4_4_ = auVar92._4_4_ * auVar133._4_4_;
                      auVar171._8_4_ = auVar92._8_4_ * auVar133._8_4_;
                      auVar171._12_4_ = auVar92._12_4_ * auVar133._12_4_;
                      auVar133 = vshufps_avx(auVar191,auVar191,0xd2);
                      auVar90._0_4_ = auVar89._0_4_ * auVar133._0_4_;
                      auVar90._4_4_ = auVar89._4_4_ * auVar133._4_4_;
                      auVar90._8_4_ = auVar89._8_4_ * auVar133._8_4_;
                      auVar90._12_4_ = auVar89._12_4_ * auVar133._12_4_;
                      auVar92 = vsubps_avx(auVar171,auVar90);
                      auVar133 = vshufps_avx(auVar92,auVar92,0xe9);
                      local_8e0 = vmovlps_avx(auVar133);
                      local_8d8 = auVar92._0_4_;
                      local_8d0 = 0;
                      local_8cc = (undefined4)local_8a8;
                      local_8c8 = (undefined4)local_a48;
                      local_8c4 = context->user->instID[0];
                      local_8c0 = context->user->instPrimID[0];
                      ray->tfar = local_aa0;
                      local_ac4 = -1;
                      local_9b0.valid = &local_ac4;
                      local_9b0.geometryUserPtr = pGVar8->userPtr;
                      local_9b0.context = context->user;
                      local_9b0.hit = (RTCHitN *)&local_8e0;
                      local_9b0.N = 1;
                      local_9b0.ray = (RTCRayN *)ray;
                      local_8d4 = fVar233;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f1bd68:
                        p_Var9 = context->args->filter;
                        fVar233 = (float)local_ac0._0_4_;
                        fVar206 = (float)local_940._0_4_;
                        fVar198 = (float)local_940._4_4_;
                        fVar223 = fStack_938;
                        fVar252 = fStack_934;
                        fVar199 = fStack_930;
                        fVar225 = fStack_92c;
                        fVar254 = fStack_928;
                        fVar183 = (float)local_8a0._0_4_;
                        fVar200 = (float)local_8a0._4_4_;
                        fVar227 = fStack_898;
                        fVar256 = fStack_894;
                        fVar201 = fStack_890;
                        fVar202 = fStack_88c;
                        fVar203 = fStack_888;
                        if (p_Var9 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var9)(&local_9b0);
                            auVar322 = ZEXT3264(local_a20);
                            auVar328 = ZEXT3264(local_900);
                            auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar206 = (float)local_940._0_4_;
                            fVar198 = (float)local_940._4_4_;
                            fVar223 = fStack_938;
                            fVar252 = fStack_934;
                            fVar199 = fStack_930;
                            fVar225 = fStack_92c;
                            fVar254 = fStack_928;
                            fVar183 = (float)local_8a0._0_4_;
                            fVar200 = (float)local_8a0._4_4_;
                            fVar227 = fStack_898;
                            fVar256 = fStack_894;
                            fVar201 = fStack_890;
                            fVar202 = fStack_88c;
                            fVar203 = fStack_888;
                          }
                          fVar233 = (float)local_ac0._0_4_;
                          if (*local_9b0.valid == 0) {
                            unaff_R14B = 0;
                            goto LAB_00f1bdf0;
                          }
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar276 = ZEXT1664(local_a40._0_16_);
                        (*pGVar8->occlusionFilterN)(&local_9b0);
                        auVar322 = ZEXT3264(local_a20);
                        auVar328 = ZEXT3264(local_900);
                        auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_9b0.valid != 0) goto LAB_00f1bd68;
                        unaff_R14B = 0;
                        fVar233 = (float)local_ac0._0_4_;
                        fVar206 = (float)local_940._0_4_;
                        fVar198 = (float)local_940._4_4_;
                        fVar223 = fStack_938;
                        fVar252 = fStack_934;
                        fVar199 = fStack_930;
                        fVar225 = fStack_92c;
                        fVar254 = fStack_928;
                        fVar183 = (float)local_8a0._0_4_;
                        fVar200 = (float)local_8a0._4_4_;
                        fVar227 = fStack_898;
                        fVar256 = fStack_894;
                        fVar201 = fStack_890;
                        fVar202 = fStack_88c;
                        fVar203 = fStack_888;
                      }
LAB_00f1bdf0:
                      if (unaff_R14B == 0) {
                        ray->tfar = fVar233;
                      }
                    }
                    bVar59 = false;
                  }
                }
                if (!bVar59) goto LAB_00f1be10;
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              unaff_R14B = 0;
              fVar206 = (float)local_940._0_4_;
              fVar198 = (float)local_940._4_4_;
              fVar223 = fStack_938;
              fVar252 = fStack_934;
              fVar199 = fStack_930;
              fVar225 = fStack_92c;
              fVar254 = fStack_928;
LAB_00f1be10:
              unaff_R14B = unaff_R14B & 1;
              bVar75 = bVar75 | unaff_R14B;
              fVar233 = ray->tfar;
              auVar104._4_4_ = fVar233;
              auVar104._0_4_ = fVar233;
              auVar104._8_4_ = fVar233;
              auVar104._12_4_ = fVar233;
              auVar104._16_4_ = fVar233;
              auVar104._20_4_ = fVar233;
              auVar104._24_4_ = fVar233;
              auVar104._28_4_ = fVar233;
              auVar98 = vcmpps_avx(_local_740,auVar104,2);
              auVar97 = vandps_avx(auVar98,local_560);
              auVar13 = local_560 & auVar98;
              uVar78 = local_5c0;
              local_560 = auVar97;
            } while ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar13 >> 0x7f,0) != '\0') ||
                       (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar13 >> 0xbf,0) != '\0') ||
                     (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar13[0x1f] < '\0');
          }
          auVar105._0_4_ =
               fVar183 * (float)local_600._0_4_ +
               fVar206 * (float)local_5e0._0_4_ + local_640 * (float)local_760._0_4_;
          auVar105._4_4_ =
               fVar200 * (float)local_600._4_4_ +
               fVar198 * (float)local_5e0._4_4_ + fStack_63c * (float)local_760._4_4_;
          auVar105._8_4_ = fVar227 * fStack_5f8 + fVar223 * fStack_5d8 + fStack_638 * fStack_758;
          auVar105._12_4_ = fVar256 * fStack_5f4 + fVar252 * fStack_5d4 + fStack_634 * fStack_754;
          auVar105._16_4_ = fVar201 * fStack_5f0 + fVar199 * fStack_5d0 + fStack_630 * fStack_750;
          auVar105._20_4_ = fVar202 * fStack_5ec + fVar225 * fStack_5cc + fStack_62c * fStack_74c;
          auVar105._24_4_ = fVar203 * fStack_5e8 + fVar254 * fStack_5c8 + fStack_628 * fStack_748;
          auVar105._28_4_ = auVar98._28_4_ + auVar98._28_4_ + fStack_624;
          auVar145._8_4_ = 0x7fffffff;
          auVar145._0_8_ = 0x7fffffff7fffffff;
          auVar145._12_4_ = 0x7fffffff;
          auVar145._16_4_ = 0x7fffffff;
          auVar145._20_4_ = 0x7fffffff;
          auVar145._24_4_ = 0x7fffffff;
          auVar145._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar105,auVar145);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar146,1);
          auVar98 = vorps_avx(auVar97,local_540);
          auVar147._0_4_ = (float)local_7c0._0_4_ + (float)local_500._0_4_;
          auVar147._4_4_ = (float)local_7c0._4_4_ + (float)local_500._4_4_;
          auVar147._8_4_ = fStack_7b8 + fStack_4f8;
          auVar147._12_4_ = fStack_7b4 + fStack_4f4;
          auVar147._16_4_ = fStack_7b0 + fStack_4f0;
          auVar147._20_4_ = fStack_7ac + fStack_4ec;
          auVar147._24_4_ = fStack_7a8 + fStack_4e8;
          auVar147._28_4_ = fStack_7a4 + fStack_4e4;
          fVar183 = ray->tfar;
          auVar179._4_4_ = fVar183;
          auVar179._0_4_ = fVar183;
          auVar179._8_4_ = fVar183;
          auVar179._12_4_ = fVar183;
          auVar179._16_4_ = fVar183;
          auVar179._20_4_ = fVar183;
          auVar179._24_4_ = fVar183;
          auVar179._28_4_ = fVar183;
          auVar97 = vcmpps_avx(auVar147,auVar179,2);
          _local_740 = vandps_avx(auVar97,local_520);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar180,auVar148,auVar98);
          auVar133 = vpcmpgtd_avx(auVar97._16_16_,local_400);
          auVar92 = vpshufd_avx(local_660._0_16_,0);
          auVar92 = vpcmpgtd_avx(auVar97._0_16_,auVar92);
          auVar149._16_16_ = auVar133;
          auVar149._0_16_ = auVar92;
          _local_760 = vblendps_avx(ZEXT1632(auVar92),auVar149,0xf0);
          auVar97 = vandnps_avx(_local_760,_local_740);
          auVar98 = _local_740 & ~_local_760;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            local_700 = _local_3e0;
            local_720 = (float)local_7c0._0_4_ + (float)local_3e0._0_4_;
            fStack_71c = (float)local_7c0._4_4_ + (float)local_3e0._4_4_;
            fStack_718 = fStack_7b8 + fStack_3d8;
            fStack_714 = fStack_7b4 + fStack_3d4;
            fStack_710 = fStack_7b0 + fStack_3d0;
            fStack_70c = fStack_7ac + fStack_3cc;
            fStack_708 = fStack_7a8 + fStack_3c8;
            fStack_704 = fStack_7a4 + fStack_3c4;
            do {
              auVar216 = auVar250._0_16_;
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar98 = vblendvps_avx(auVar150,local_700,auVar97);
              auVar13 = vshufps_avx(auVar98,auVar98,0xb1);
              auVar13 = vminps_avx(auVar98,auVar13);
              auVar134 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar134);
              auVar134 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar134);
              auVar13 = vcmpps_avx(auVar98,auVar13,0);
              auVar134 = auVar97 & auVar13;
              auVar98 = auVar97;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar98 = vandps_avx(auVar13,auVar97);
              }
              uVar73 = vmovmskps_avx(auVar98);
              uVar72 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
                }
              }
              uVar78 = (ulong)uVar72;
              local_580 = auVar97;
              *(undefined4 *)(local_580 + uVar78 * 4) = 0;
              aVar6 = (ray->dir).field_0;
              _local_980 = (undefined1  [16])aVar6;
              auVar133 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
              _local_a80 = ZEXT416((uint)local_440[uVar78]);
              local_aa0 = *(float *)(local_3c0 + uVar78 * 4);
              auVar293 = ZEXT464((uint)local_aa0);
              if (auVar133._0_4_ < 0.0) {
                uStack_a9c = 0;
                uStack_a98 = 0;
                uStack_a94 = 0;
                fVar183 = sqrtf(auVar133._0_4_);
                auVar293 = ZEXT1664(CONCAT412(uStack_a94,
                                              CONCAT48(uStack_a98,CONCAT44(uStack_a9c,local_aa0))));
                auVar216._8_4_ = 0x7fffffff;
                auVar216._0_8_ = 0x7fffffff7fffffff;
                auVar216._12_4_ = 0x7fffffff;
              }
              else {
                auVar133 = vsqrtss_avx(auVar133,auVar133);
                fVar183 = auVar133._0_4_;
              }
              auVar92 = vminps_avx(_local_9c0,_local_9e0);
              auVar133 = vmaxps_avx(_local_9c0,_local_9e0);
              auVar191 = vminps_avx(_local_9d0,_local_9f0);
              auVar132 = vminps_avx(auVar92,auVar191);
              auVar92 = vmaxps_avx(_local_9d0,_local_9f0);
              auVar191 = vmaxps_avx(auVar133,auVar92);
              auVar133 = vandps_avx(auVar132,auVar216);
              auVar92 = vandps_avx(auVar191,auVar216);
              auVar133 = vmaxps_avx(auVar133,auVar92);
              auVar92 = vmovshdup_avx(auVar133);
              auVar92 = vmaxss_avx(auVar92,auVar133);
              auVar133 = vshufpd_avx(auVar133,auVar133,1);
              auVar133 = vmaxss_avx(auVar133,auVar92);
              local_820._0_4_ = auVar133._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar183 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar191,auVar191,0xff);
              lVar76 = 5;
              auVar251 = ZEXT1664(_local_a80);
              do {
                fVar223 = 1.0 - auVar251._0_4_;
                auVar133 = auVar251._0_16_;
                _local_a80 = auVar133;
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                fVar183 = auVar133._0_4_;
                fVar206 = auVar133._4_4_;
                fVar233 = auVar133._8_4_;
                fVar198 = auVar133._12_4_;
                auVar133 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                fVar252 = auVar133._0_4_;
                fVar199 = auVar133._4_4_;
                fVar225 = auVar133._8_4_;
                fVar254 = auVar133._12_4_;
                fVar200 = (float)local_9d0._0_4_ * fVar183 + (float)local_9e0._0_4_ * fVar252;
                fVar227 = (float)local_9d0._4_4_ * fVar206 + (float)local_9e0._4_4_ * fVar199;
                fVar256 = fStack_9c8 * fVar233 + fStack_9d8 * fVar225;
                fVar201 = fStack_9c4 * fVar198 + fStack_9d4 * fVar254;
                local_920._0_4_ =
                     fVar252 * ((float)local_9e0._0_4_ * fVar183 + fVar252 * (float)local_9c0._0_4_)
                     + fVar183 * fVar200;
                local_920._4_4_ =
                     fVar199 * ((float)local_9e0._4_4_ * fVar206 + fVar199 * (float)local_9c0._4_4_)
                     + fVar206 * fVar227;
                local_920._8_4_ =
                     fVar225 * (fStack_9d8 * fVar233 + fVar225 * fStack_9b8) + fVar233 * fVar256;
                local_920._12_4_ =
                     fVar254 * (fStack_9d4 * fVar198 + fVar254 * fStack_9b4) + fVar198 * fVar201;
                auVar190._0_4_ =
                     fVar252 * fVar200 +
                     fVar183 * (fVar183 * (float)local_9f0._0_4_ + (float)local_9d0._0_4_ * fVar252)
                ;
                auVar190._4_4_ =
                     fVar199 * fVar227 +
                     fVar206 * (fVar206 * (float)local_9f0._4_4_ + (float)local_9d0._4_4_ * fVar199)
                ;
                auVar190._8_4_ =
                     fVar225 * fVar256 + fVar233 * (fVar233 * fStack_9e8 + fStack_9c8 * fVar225);
                auVar190._12_4_ =
                     fVar254 * fVar201 + fVar198 * (fVar198 * fStack_9e4 + fStack_9c4 * fVar254);
                auVar358 = auVar293._0_16_;
                auVar133 = vshufps_avx(auVar358,auVar358,0);
                auVar129._0_4_ = auVar133._0_4_ * (float)local_980._0_4_ + 0.0;
                auVar129._4_4_ = auVar133._4_4_ * (float)local_980._4_4_ + 0.0;
                auVar129._8_4_ = auVar133._8_4_ * fStack_978 + 0.0;
                auVar129._12_4_ = auVar133._12_4_ * fStack_974 + 0.0;
                auVar91._0_4_ = fVar252 * local_920._0_4_ + fVar183 * auVar190._0_4_;
                auVar91._4_4_ = fVar199 * local_920._4_4_ + fVar206 * auVar190._4_4_;
                auVar91._8_4_ = fVar225 * local_920._8_4_ + fVar233 * auVar190._8_4_;
                auVar91._12_4_ = fVar254 * local_920._12_4_ + fVar198 * auVar190._12_4_;
                local_680._0_16_ = auVar91;
                auVar133 = vsubps_avx(auVar129,auVar91);
                _local_840 = auVar133;
                auVar133 = vdpps_avx(auVar133,auVar133,0x7f);
                local_aa0 = auVar293._0_4_;
                uStack_a9c = auVar293._4_4_;
                uStack_a98 = auVar293._8_4_;
                uStack_a94 = auVar293._12_4_;
                _local_960 = auVar133;
                if (auVar133._0_4_ < 0.0) {
                  _local_ac0 = ZEXT416((uint)fVar223);
                  local_a40._0_16_ = auVar190;
                  fVar183 = sqrtf(auVar133._0_4_);
                  auVar358._4_4_ = uStack_a9c;
                  auVar358._0_4_ = local_aa0;
                  auVar358._8_4_ = uStack_a98;
                  auVar358._12_4_ = uStack_a94;
                  auVar190 = local_a40._0_16_;
                  fVar223 = (float)local_ac0._0_4_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar183 = auVar133._0_4_;
                }
                auVar133 = vsubps_avx(auVar190,local_920._0_16_);
                local_920._0_4_ = auVar133._0_4_ * 3.0;
                local_920._4_4_ = auVar133._4_4_ * 3.0;
                local_920._8_4_ = auVar133._8_4_ * 3.0;
                local_920._12_4_ = auVar133._12_4_ * 3.0;
                auVar133 = vshufps_avx(ZEXT416((uint)((float)local_a80._0_4_ * 6.0)),
                                       ZEXT416((uint)((float)local_a80._0_4_ * 6.0)),0);
                auVar92 = ZEXT416((uint)((fVar223 -
                                         ((float)local_a80._0_4_ + (float)local_a80._0_4_)) * 6.0));
                auVar191 = vshufps_avx(auVar92,auVar92,0);
                auVar92 = ZEXT416((uint)(((float)local_a80._0_4_ - (fVar223 + fVar223)) * 6.0));
                auVar132 = vshufps_avx(auVar92,auVar92,0);
                auVar10 = vshufps_avx(ZEXT416((uint)(fVar223 * 6.0)),ZEXT416((uint)(fVar223 * 6.0)),
                                      0);
                auVar92 = vdpps_avx(local_920._0_16_,local_920._0_16_,0x7f);
                auVar130._0_4_ =
                     auVar10._0_4_ * (float)local_9c0._0_4_ +
                     auVar132._0_4_ * (float)local_9e0._0_4_ +
                     auVar133._0_4_ * (float)local_9f0._0_4_ +
                     auVar191._0_4_ * (float)local_9d0._0_4_;
                auVar130._4_4_ =
                     auVar10._4_4_ * (float)local_9c0._4_4_ +
                     auVar132._4_4_ * (float)local_9e0._4_4_ +
                     auVar133._4_4_ * (float)local_9f0._4_4_ +
                     auVar191._4_4_ * (float)local_9d0._4_4_;
                auVar130._8_4_ =
                     auVar10._8_4_ * fStack_9b8 +
                     auVar132._8_4_ * fStack_9d8 +
                     auVar133._8_4_ * fStack_9e8 + auVar191._8_4_ * fStack_9c8;
                auVar130._12_4_ =
                     auVar10._12_4_ * fStack_9b4 +
                     auVar132._12_4_ * fStack_9d4 +
                     auVar133._12_4_ * fStack_9e4 + auVar191._12_4_ * fStack_9c4;
                auVar133 = vblendps_avx(auVar92,_DAT_01feba10,0xe);
                auVar191 = vrsqrtss_avx(auVar133,auVar133);
                fVar233 = auVar191._0_4_;
                fVar206 = auVar92._0_4_;
                auVar191 = vdpps_avx(local_920._0_16_,auVar130,0x7f);
                auVar132 = vshufps_avx(auVar92,auVar92,0);
                auVar131._0_4_ = auVar130._0_4_ * auVar132._0_4_;
                auVar131._4_4_ = auVar130._4_4_ * auVar132._4_4_;
                auVar131._8_4_ = auVar130._8_4_ * auVar132._8_4_;
                auVar131._12_4_ = auVar130._12_4_ * auVar132._12_4_;
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar217._0_4_ = local_920._0_4_ * auVar191._0_4_;
                auVar217._4_4_ = local_920._4_4_ * auVar191._4_4_;
                auVar217._8_4_ = local_920._8_4_ * auVar191._8_4_;
                auVar217._12_4_ = local_920._12_4_ * auVar191._12_4_;
                auVar132 = vsubps_avx(auVar131,auVar217);
                auVar191 = vrcpss_avx(auVar133,auVar133);
                auVar133 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar358._0_4_ * (float)local_6a0._0_4_)));
                local_ac0._0_4_ = auVar133._0_4_;
                auVar133 = ZEXT416((uint)(auVar191._0_4_ * (2.0 - fVar206 * auVar191._0_4_)));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                uVar78 = CONCAT44(local_920._4_4_,local_920._0_4_);
                auVar309._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar309._8_4_ = -local_920._8_4_;
                auVar309._12_4_ = -local_920._12_4_;
                auVar191 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar206 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar192._0_4_ = auVar191._0_4_ * auVar132._0_4_ * auVar133._0_4_;
                auVar192._4_4_ = auVar191._4_4_ * auVar132._4_4_ * auVar133._4_4_;
                auVar192._8_4_ = auVar191._8_4_ * auVar132._8_4_ * auVar133._8_4_;
                auVar192._12_4_ = auVar191._12_4_ * auVar132._12_4_ * auVar133._12_4_;
                local_880._0_4_ = local_920._0_4_ * auVar191._0_4_;
                local_880._4_4_ = local_920._4_4_ * auVar191._4_4_;
                local_880._8_4_ = local_920._8_4_ * auVar191._8_4_;
                local_880._12_4_ = local_920._12_4_ * auVar191._12_4_;
                if (fVar206 < 0.0) {
                  local_a40._0_4_ = fVar183;
                  local_860._0_16_ = auVar309;
                  _local_940 = auVar192;
                  fVar206 = sqrtf(fVar206);
                  auVar192 = _local_940;
                  auVar309 = local_860._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar92,auVar92);
                  fVar206 = auVar133._0_4_;
                  local_a40._0_4_ = fVar183;
                }
                auVar133 = vdpps_avx(_local_840,local_880._0_16_,0x7f);
                local_860._0_4_ =
                     ((float)local_820._0_4_ / fVar206) * ((float)local_a40._0_4_ + 1.0) +
                     (float)local_a40._0_4_ * (float)local_820._0_4_ + (float)local_ac0._0_4_;
                auVar92 = vdpps_avx(auVar309,local_880._0_16_,0x7f);
                auVar191 = vdpps_avx(_local_840,auVar192,0x7f);
                auVar132 = vdpps_avx(_local_980,local_880._0_16_,0x7f);
                auVar10 = vdpps_avx(_local_840,auVar309,0x7f);
                fVar183 = auVar92._0_4_ + auVar191._0_4_;
                fVar206 = auVar133._0_4_;
                auVar93._0_4_ = fVar206 * fVar206;
                auVar93._4_4_ = auVar133._4_4_ * auVar133._4_4_;
                auVar93._8_4_ = auVar133._8_4_ * auVar133._8_4_;
                auVar93._12_4_ = auVar133._12_4_ * auVar133._12_4_;
                auVar191 = vsubps_avx(_local_960,auVar93);
                local_880._0_16_ = ZEXT416((uint)fVar183);
                auVar92 = vdpps_avx(_local_840,_local_980,0x7f);
                fVar233 = auVar10._0_4_ - fVar206 * fVar183;
                local_a40._0_16_ = auVar133;
                fVar206 = auVar92._0_4_ - auVar132._0_4_ * fVar206;
                auVar133 = vrsqrtss_avx(auVar191,auVar191);
                fVar198 = auVar191._0_4_;
                fVar183 = auVar133._0_4_;
                fVar183 = fVar183 * 1.5 + fVar198 * -0.5 * fVar183 * fVar183 * fVar183;
                if (fVar198 < 0.0) {
                  _local_940 = auVar132;
                  local_8a0._0_4_ = fVar233;
                  local_7e0._0_4_ = fVar206;
                  local_6c0._0_4_ = fVar183;
                  fVar198 = sqrtf(fVar198);
                  fVar183 = (float)local_6c0._0_4_;
                  fVar233 = (float)local_8a0._0_4_;
                  fVar206 = (float)local_7e0._0_4_;
                  auVar132 = _local_940;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar191,auVar191);
                  fVar198 = auVar133._0_4_;
                }
                auVar328 = ZEXT3264(local_900);
                auVar322 = ZEXT3264(local_a20);
                auVar191 = vpermilps_avx(local_680._0_16_,0xff);
                auVar10 = vpermilps_avx(local_920._0_16_,0xff);
                fVar233 = fVar233 * fVar183 - auVar10._0_4_;
                auVar218._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
                auVar218._8_4_ = auVar132._8_4_ ^ 0x80000000;
                auVar218._12_4_ = auVar132._12_4_ ^ 0x80000000;
                auVar239._0_4_ = -fVar233;
                auVar239._4_4_ = 0x80000000;
                auVar239._8_4_ = 0x80000000;
                auVar239._12_4_ = 0x80000000;
                auVar133 = vinsertps_avx(ZEXT416((uint)(fVar206 * fVar183)),auVar218,0x10);
                auVar92 = vmovsldup_avx(ZEXT416((uint)(local_880._0_4_ * fVar206 * fVar183 -
                                                      auVar132._0_4_ * fVar233)));
                auVar133 = vdivps_avx(auVar133,auVar92);
                auVar276 = ZEXT1664(local_a40._0_16_);
                auVar132 = ZEXT416((uint)(fVar198 - auVar191._0_4_));
                auVar191 = vinsertps_avx(local_a40._0_16_,auVar132,0x10);
                auVar193._0_4_ = auVar191._0_4_ * auVar133._0_4_;
                auVar193._4_4_ = auVar191._4_4_ * auVar133._4_4_;
                auVar193._8_4_ = auVar191._8_4_ * auVar133._8_4_;
                auVar193._12_4_ = auVar191._12_4_ * auVar133._12_4_;
                auVar133 = vinsertps_avx(auVar239,local_880._0_16_,0x1c);
                auVar133 = vdivps_avx(auVar133,auVar92);
                auVar92 = vhaddps_avx(auVar193,auVar193);
                auVar172._0_4_ = auVar191._0_4_ * auVar133._0_4_;
                auVar172._4_4_ = auVar191._4_4_ * auVar133._4_4_;
                auVar172._8_4_ = auVar191._8_4_ * auVar133._8_4_;
                auVar172._12_4_ = auVar191._12_4_ * auVar133._12_4_;
                auVar133 = vhaddps_avx(auVar172,auVar172);
                fVar183 = (float)local_a80._0_4_ - auVar92._0_4_;
                auVar251 = ZEXT464((uint)fVar183);
                local_aa0 = local_aa0 - auVar133._0_4_;
                auVar219._8_4_ = 0x7fffffff;
                auVar219._0_8_ = 0x7fffffff7fffffff;
                auVar219._12_4_ = 0x7fffffff;
                auVar250 = ZEXT1664(auVar219);
                auVar133 = vandps_avx(local_a40._0_16_,auVar219);
                bVar59 = true;
                if ((float)local_860._0_4_ <= auVar133._0_4_) {
LAB_00f1c600:
                  auVar293 = ZEXT464((uint)local_aa0);
                }
                else {
                  auVar133 = vandps_avx(auVar132,auVar219);
                  if ((float)local_6e0._0_4_ * 1.9073486e-06 +
                      (float)local_860._0_4_ + (float)local_ac0._0_4_ <= auVar133._0_4_)
                  goto LAB_00f1c600;
                  local_aa0 = local_aa0 + (float)local_790._0_4_;
                  auVar293 = ZEXT464((uint)local_aa0);
                  if ((((local_aa0 < (ray->org).field_0.m128[3]) || (ray->tfar < local_aa0)) ||
                      (fVar183 < 0.0)) || (1.0 < fVar183)) {
LAB_00f1c60a:
                    bVar59 = false;
                    unaff_R14B = 0;
                  }
                  else {
                    local_ac0._0_4_ = ray->tfar;
                    auVar133 = vrsqrtss_avx(_local_960,_local_960);
                    fVar206 = auVar133._0_4_;
                    pGVar8 = (context->scene->geometries).items[local_a48].ptr;
                    if ((pGVar8->mask & ray->mask) == 0) goto LAB_00f1c60a;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      auVar133 = ZEXT416((uint)(fVar206 * 1.5 +
                                               local_960._0_4_ * -0.5 * fVar206 * fVar206 * fVar206)
                                        );
                      auVar133 = vshufps_avx(auVar133,auVar133,0);
                      auVar173._0_4_ = auVar133._0_4_ * (float)local_840._0_4_;
                      auVar173._4_4_ = auVar133._4_4_ * (float)local_840._4_4_;
                      auVar173._8_4_ = auVar133._8_4_ * fStack_838;
                      auVar173._12_4_ = auVar133._12_4_ * fStack_834;
                      auVar94._0_4_ = local_920._0_4_ + auVar10._0_4_ * auVar173._0_4_;
                      auVar94._4_4_ = local_920._4_4_ + auVar10._4_4_ * auVar173._4_4_;
                      auVar94._8_4_ = local_920._8_4_ + auVar10._8_4_ * auVar173._8_4_;
                      auVar94._12_4_ = local_920._12_4_ + auVar10._12_4_ * auVar173._12_4_;
                      auVar133 = vshufps_avx(auVar173,auVar173,0xc9);
                      auVar92 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                      auVar194._0_4_ = auVar92._0_4_ * auVar173._0_4_;
                      auVar194._4_4_ = auVar92._4_4_ * auVar173._4_4_;
                      auVar194._8_4_ = auVar92._8_4_ * auVar173._8_4_;
                      auVar194._12_4_ = auVar92._12_4_ * auVar173._12_4_;
                      auVar174._0_4_ = auVar133._0_4_ * local_920._0_4_;
                      auVar174._4_4_ = auVar133._4_4_ * local_920._4_4_;
                      auVar174._8_4_ = auVar133._8_4_ * local_920._8_4_;
                      auVar174._12_4_ = auVar133._12_4_ * local_920._12_4_;
                      auVar191 = vsubps_avx(auVar174,auVar194);
                      auVar133 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar92 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar175._0_4_ = auVar92._0_4_ * auVar133._0_4_;
                      auVar175._4_4_ = auVar92._4_4_ * auVar133._4_4_;
                      auVar175._8_4_ = auVar92._8_4_ * auVar133._8_4_;
                      auVar175._12_4_ = auVar92._12_4_ * auVar133._12_4_;
                      auVar133 = vshufps_avx(auVar191,auVar191,0xd2);
                      auVar95._0_4_ = auVar94._0_4_ * auVar133._0_4_;
                      auVar95._4_4_ = auVar94._4_4_ * auVar133._4_4_;
                      auVar95._8_4_ = auVar94._8_4_ * auVar133._8_4_;
                      auVar95._12_4_ = auVar94._12_4_ * auVar133._12_4_;
                      auVar92 = vsubps_avx(auVar175,auVar95);
                      auVar133 = vshufps_avx(auVar92,auVar92,0xe9);
                      local_8e0 = vmovlps_avx(auVar133);
                      local_8d8 = auVar92._0_4_;
                      local_8d0 = 0;
                      local_8cc = (undefined4)local_8a8;
                      local_8c8 = (undefined4)local_a48;
                      local_8c4 = context->user->instID[0];
                      local_8c0 = context->user->instPrimID[0];
                      ray->tfar = local_aa0;
                      local_ac4 = -1;
                      local_9b0.valid = &local_ac4;
                      local_9b0.geometryUserPtr = pGVar8->userPtr;
                      local_9b0.context = context->user;
                      local_9b0.hit = (RTCHitN *)&local_8e0;
                      local_9b0.N = 1;
                      _local_a80 = ZEXT416((uint)fVar183);
                      uStack_a9c = 0;
                      uStack_a98 = 0;
                      uStack_a94 = 0;
                      local_9b0.ray = (RTCRayN *)ray;
                      local_8d4 = fVar183;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f1c798:
                        p_Var9 = context->args->filter;
                        fVar183 = (float)local_ac0._0_4_;
                        if (p_Var9 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var9)(&local_9b0);
                            auVar293 = ZEXT1664(CONCAT412(uStack_a94,
                                                          CONCAT48(uStack_a98,
                                                                   CONCAT44(uStack_a9c,local_aa0))))
                            ;
                            auVar251 = ZEXT1664(_local_a80);
                            auVar322 = ZEXT3264(local_a20);
                            auVar328 = ZEXT3264(local_900);
                            auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          fVar183 = (float)local_ac0._0_4_;
                          if (*local_9b0.valid == 0) {
                            unaff_R14B = 0;
                            goto LAB_00f1c81a;
                          }
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar276 = ZEXT1664(local_a40._0_16_);
                        (*pGVar8->occlusionFilterN)(&local_9b0);
                        auVar293 = ZEXT1664(CONCAT412(uStack_a94,
                                                      CONCAT48(uStack_a98,
                                                               CONCAT44(uStack_a9c,local_aa0))));
                        auVar251 = ZEXT1664(_local_a80);
                        auVar322 = ZEXT3264(local_a20);
                        auVar328 = ZEXT3264(local_900);
                        auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_9b0.valid != 0) goto LAB_00f1c798;
                        unaff_R14B = 0;
                        fVar183 = (float)local_ac0._0_4_;
                      }
LAB_00f1c81a:
                      if (unaff_R14B == 0) {
                        ray->tfar = fVar183;
                      }
                    }
                    bVar59 = false;
                  }
                }
                if (!bVar59) goto LAB_00f1c831;
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              unaff_R14B = 0;
LAB_00f1c831:
              unaff_R14B = unaff_R14B & 1;
              bVar75 = bVar75 | unaff_R14B;
              fVar183 = ray->tfar;
              auVar106._4_4_ = fVar183;
              auVar106._0_4_ = fVar183;
              auVar106._8_4_ = fVar183;
              auVar106._12_4_ = fVar183;
              auVar106._16_4_ = fVar183;
              auVar106._20_4_ = fVar183;
              auVar106._24_4_ = fVar183;
              auVar106._28_4_ = fVar183;
              auVar69._4_4_ = fStack_71c;
              auVar69._0_4_ = local_720;
              auVar69._8_4_ = fStack_718;
              auVar69._12_4_ = fStack_714;
              auVar69._16_4_ = fStack_710;
              auVar69._20_4_ = fStack_70c;
              auVar69._24_4_ = fStack_708;
              auVar69._28_4_ = fStack_704;
              auVar98 = vcmpps_avx(auVar69,auVar106,2);
              auVar97 = vandps_avx(auVar98,local_580);
              local_580 = local_580 & auVar98;
              uVar78 = local_5c0;
            } while ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_580 >> 0x7f,0) != '\0') ||
                       (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_580 >> 0xbf,0) != '\0') ||
                     (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_580[0x1f] < '\0');
          }
          auVar97 = vandps_avx(local_4e0,local_4c0);
          auVar98 = vandps_avx(_local_760,_local_740);
          auVar181._0_4_ = (float)local_7c0._0_4_ + local_3a0._0_4_;
          auVar181._4_4_ = (float)local_7c0._4_4_ + local_3a0._4_4_;
          auVar181._8_4_ = fStack_7b8 + local_3a0._8_4_;
          auVar181._12_4_ = fStack_7b4 + local_3a0._12_4_;
          auVar181._16_4_ = fStack_7b0 + local_3a0._16_4_;
          auVar181._20_4_ = fStack_7ac + local_3a0._20_4_;
          auVar181._24_4_ = fStack_7a8 + local_3a0._24_4_;
          auVar181._28_4_ = fStack_7a4 + local_3a0._28_4_;
          fVar183 = ray->tfar;
          auVar222._4_4_ = fVar183;
          auVar222._0_4_ = fVar183;
          auVar222._8_4_ = fVar183;
          auVar222._12_4_ = fVar183;
          auVar222._16_4_ = fVar183;
          auVar222._20_4_ = fVar183;
          auVar222._24_4_ = fVar183;
          auVar222._28_4_ = fVar183;
          auVar13 = vcmpps_avx(auVar181,auVar222,2);
          auVar97 = vandps_avx(auVar13,auVar97);
          auVar248._0_4_ = (float)local_7c0._0_4_ + local_3e0._0_4_;
          auVar248._4_4_ = (float)local_7c0._4_4_ + local_3e0._4_4_;
          auVar248._8_4_ = fStack_7b8 + local_3e0._8_4_;
          auVar248._12_4_ = fStack_7b4 + local_3e0._12_4_;
          auVar248._16_4_ = fStack_7b0 + local_3e0._16_4_;
          auVar248._20_4_ = fStack_7ac + local_3e0._20_4_;
          auVar248._24_4_ = fStack_7a8 + local_3e0._24_4_;
          auVar248._28_4_ = fStack_7a4 + local_3e0._28_4_;
          auVar250 = ZEXT3264(auVar248);
          auVar13 = vcmpps_avx(auVar248,auVar222,2);
          auVar98 = vandps_avx(auVar13,auVar98);
          auVar98 = vorps_avx(auVar97,auVar98);
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar74 * 0x60) = auVar98;
            auVar97 = vblendvps_avx(_local_3e0,local_3a0,auVar97);
            *(undefined1 (*) [32])(auStack_160 + uVar74 * 0x60) = auVar97;
            uVar3 = vmovlps_avx(local_780);
            *(undefined8 *)(afStack_140 + uVar74 * 0x18) = uVar3;
            auStack_138[uVar74 * 0x18] = (int)uVar78 + 1;
            uVar74 = (ulong)((int)uVar74 + 1);
          }
          auVar293 = ZEXT3264(local_800);
        }
      }
    }
    fVar183 = ray->tfar;
    auVar107._4_4_ = fVar183;
    auVar107._0_4_ = fVar183;
    auVar107._8_4_ = fVar183;
    auVar107._12_4_ = fVar183;
    auVar107._16_4_ = fVar183;
    auVar107._20_4_ = fVar183;
    auVar107._24_4_ = fVar183;
    auVar107._28_4_ = fVar183;
    do {
      uVar72 = (uint)uVar74;
      if (uVar72 == 0) {
        if (bVar75 != 0) {
          return local_ad1;
        }
        fVar183 = ray->tfar;
        auVar96._4_4_ = fVar183;
        auVar96._0_4_ = fVar183;
        auVar96._8_4_ = fVar183;
        auVar96._12_4_ = fVar183;
        auVar133 = vcmpps_avx(local_3f0,auVar96,2);
        uVar72 = vmovmskps_avx(auVar133);
        uVar72 = (uint)local_768 - 1 & (uint)local_768 & uVar72;
        local_ad1 = uVar72 != 0;
        if (!local_ad1) {
          return local_ad1;
        }
        goto LAB_00f1a358;
      }
      uVar74 = (ulong)(uVar72 - 1);
      lVar76 = uVar74 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar151._0_4_ = (float)local_7c0._0_4_ + auVar97._0_4_;
      auVar151._4_4_ = (float)local_7c0._4_4_ + auVar97._4_4_;
      auVar151._8_4_ = fStack_7b8 + auVar97._8_4_;
      auVar151._12_4_ = fStack_7b4 + auVar97._12_4_;
      auVar151._16_4_ = fStack_7b0 + auVar97._16_4_;
      auVar151._20_4_ = fStack_7ac + auVar97._20_4_;
      auVar151._24_4_ = fStack_7a8 + auVar97._24_4_;
      auVar151._28_4_ = fStack_7a4 + auVar97._28_4_;
      auVar13 = vcmpps_avx(auVar151,auVar107,2);
      auVar98 = vandps_avx(auVar13,*(undefined1 (*) [32])(auStack_180 + lVar76));
      local_3a0 = auVar98;
      auVar13 = *(undefined1 (*) [32])(auStack_180 + lVar76) & auVar13;
      bVar65 = (auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar64 = (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = SUB321(auVar13 >> 0x7f,0) == '\0';
      bVar62 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar61 = SUB321(auVar13 >> 0xbf,0) == '\0';
      bVar60 = (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar59 = -1 < auVar13[0x1f];
      if (((((((!bVar65 || !bVar66) || !bVar64) || !bVar63) || !bVar62) || !bVar61) || !bVar60) ||
          !bVar59) {
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar97 = vblendvps_avx(auVar197,auVar97,auVar98);
        auVar13 = vshufps_avx(auVar97,auVar97,0xb1);
        auVar13 = vminps_avx(auVar97,auVar13);
        auVar134 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar134);
        auVar134 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar134);
        auVar97 = vcmpps_avx(auVar97,auVar13,0);
        auVar13 = auVar98 & auVar97;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar98 = vandps_avx(auVar97,auVar98);
        }
        fVar183 = afStack_140[uVar74 * 0x18 + 1];
        uVar78 = (ulong)auStack_138[uVar74 * 0x18];
        uVar77 = vmovmskps_avx(auVar98);
        uVar73 = 0;
        if (uVar77 != 0) {
          for (; (uVar77 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
          }
        }
        fVar206 = afStack_140[uVar74 * 0x18];
        *(undefined4 *)(local_3a0 + (ulong)uVar73 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar76) = local_3a0;
        uVar77 = uVar72 - 1;
        if ((((((((local_3a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3a0 >> 0x7f,0) != '\0') ||
              (local_3a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3a0 >> 0xbf,0) != '\0') ||
            (local_3a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3a0[0x1f] < '\0') {
          uVar77 = uVar72;
        }
        auVar133 = vshufps_avx(ZEXT416((uint)(fVar183 - fVar206)),ZEXT416((uint)(fVar183 - fVar206))
                               ,0);
        local_3e0._4_4_ = fVar206 + auVar133._4_4_ * 0.14285715;
        local_3e0._0_4_ = fVar206 + auVar133._0_4_ * 0.0;
        fStack_3d8 = fVar206 + auVar133._8_4_ * 0.2857143;
        fStack_3d4 = fVar206 + auVar133._12_4_ * 0.42857146;
        fStack_3d0 = fVar206 + auVar133._0_4_ * 0.5714286;
        fStack_3cc = fVar206 + auVar133._4_4_ * 0.71428573;
        fStack_3c8 = fVar206 + auVar133._8_4_ * 0.8571429;
        fStack_3c4 = fVar206 + auVar133._12_4_;
        local_780._8_8_ = 0;
        local_780._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar73 * 4);
        uVar74 = (ulong)uVar77;
      }
    } while (((((((bVar65 && bVar66) && bVar64) && bVar63) && bVar62) && bVar61) && bVar60) &&
             bVar59);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }